

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  void *pvVar16;
  __int_type_conflict _Var17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  ulong uVar68;
  byte bVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar78 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar109 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float t1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar193;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar197;
  float fVar215;
  float fVar216;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar211 [32];
  float fVar217;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar238 [16];
  vfloat4 b0;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar274;
  undefined1 auVar273 [32];
  float pp;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar297;
  float fVar298;
  vfloat4 a0_1;
  float fVar299;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  float in_register_0000151c;
  undefined1 auVar303 [32];
  float fVar307;
  float fVar311;
  undefined1 auVar304 [64];
  float fVar312;
  float fVar318;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar316;
  float fVar317;
  undefined1 auVar315 [32];
  float fVar319;
  float fVar320;
  float fVar330;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar328;
  float fVar329;
  float in_register_0000159c;
  undefined1 auVar326 [32];
  float fVar335;
  vfloat4 a0;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float in_register_000015dc;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar233 [32];
  undefined1 auVar327 [32];
  
  PVar12 = prim[1];
  uVar75 = (ulong)(byte)PVar12;
  lVar73 = uVar75 * 5;
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar287 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar287 = vinsertps_avx(auVar287,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar197 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  auVar82 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  auVar105._0_4_ = fVar197 * auVar82._0_4_;
  auVar105._4_4_ = fVar197 * auVar82._4_4_;
  auVar105._8_4_ = fVar197 * auVar82._8_4_;
  auVar105._12_4_ = fVar197 * auVar82._12_4_;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 10)));
  auVar198._0_4_ = fVar197 * auVar287._0_4_;
  auVar198._4_4_ = fVar197 * auVar287._4_4_;
  auVar198._8_4_ = fVar197 * auVar287._8_4_;
  auVar198._12_4_ = fVar197 * auVar287._12_4_;
  auVar93._16_16_ = auVar155;
  auVar93._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar73 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar73 + 10)));
  auVar156._16_16_ = auVar287;
  auVar156._0_16_ = auVar82;
  auVar19 = vcvtdq2ps_avx(auVar156);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 10)));
  auVar169._16_16_ = auVar287;
  auVar169._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 6)));
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 10)));
  auVar20 = vcvtdq2ps_avx(auVar169);
  auVar170._16_16_ = auVar287;
  auVar170._0_16_ = auVar82;
  auVar21 = vcvtdq2ps_avx(auVar170);
  uVar72 = (ulong)((uint)(byte)PVar12 * 0xc);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar231._16_16_ = auVar287;
  auVar231._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar75 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar231);
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar75 + 10)));
  auVar249._16_16_ = auVar287;
  auVar249._0_16_ = auVar82;
  lVar18 = uVar75 * 9;
  uVar72 = (ulong)(uint)((int)lVar18 * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar249);
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar250._16_16_ = auVar287;
  auVar250._0_16_ = auVar82;
  auVar24 = vcvtdq2ps_avx(auVar250);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar75 + 6)));
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar75 + 10)));
  auVar271._16_16_ = auVar287;
  auVar271._0_16_ = auVar82;
  uVar72 = (ulong)(uint)((int)lVar73 << 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar271);
  auVar282._16_16_ = auVar287;
  auVar282._0_16_ = auVar82;
  auVar26 = vcvtdq2ps_avx(auVar282);
  auVar82 = vshufps_avx(auVar198,auVar198,0);
  auVar287 = vshufps_avx(auVar198,auVar198,0x55);
  auVar155 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar197 = auVar155._0_4_;
  fVar221 = auVar155._4_4_;
  fVar215 = auVar155._8_4_;
  fVar234 = auVar155._12_4_;
  fVar216 = auVar287._0_4_;
  fVar235 = auVar287._4_4_;
  fVar217 = auVar287._8_4_;
  fVar236 = auVar287._12_4_;
  fVar218 = auVar82._0_4_;
  fVar237 = auVar82._4_4_;
  fVar219 = auVar82._8_4_;
  fVar239 = auVar82._12_4_;
  auVar303._0_4_ = fVar218 * auVar93._0_4_ + fVar216 * auVar19._0_4_ + fVar197 * auVar20._0_4_;
  auVar303._4_4_ = fVar237 * auVar93._4_4_ + fVar235 * auVar19._4_4_ + fVar221 * auVar20._4_4_;
  auVar303._8_4_ = fVar219 * auVar93._8_4_ + fVar217 * auVar19._8_4_ + fVar215 * auVar20._8_4_;
  auVar303._12_4_ = fVar239 * auVar93._12_4_ + fVar236 * auVar19._12_4_ + fVar234 * auVar20._12_4_;
  auVar303._16_4_ = fVar218 * auVar93._16_4_ + fVar216 * auVar19._16_4_ + fVar197 * auVar20._16_4_;
  auVar303._20_4_ = fVar237 * auVar93._20_4_ + fVar235 * auVar19._20_4_ + fVar221 * auVar20._20_4_;
  auVar303._24_4_ = fVar219 * auVar93._24_4_ + fVar217 * auVar19._24_4_ + fVar215 * auVar20._24_4_;
  auVar303._28_4_ = fVar236 + in_register_000015dc + in_register_0000151c;
  auVar293._0_4_ = fVar218 * auVar21._0_4_ + fVar216 * auVar22._0_4_ + auVar23._0_4_ * fVar197;
  auVar293._4_4_ = fVar237 * auVar21._4_4_ + fVar235 * auVar22._4_4_ + auVar23._4_4_ * fVar221;
  auVar293._8_4_ = fVar219 * auVar21._8_4_ + fVar217 * auVar22._8_4_ + auVar23._8_4_ * fVar215;
  auVar293._12_4_ = fVar239 * auVar21._12_4_ + fVar236 * auVar22._12_4_ + auVar23._12_4_ * fVar234;
  auVar293._16_4_ = fVar218 * auVar21._16_4_ + fVar216 * auVar22._16_4_ + auVar23._16_4_ * fVar197;
  auVar293._20_4_ = fVar237 * auVar21._20_4_ + fVar235 * auVar22._20_4_ + auVar23._20_4_ * fVar221;
  auVar293._24_4_ = fVar219 * auVar21._24_4_ + fVar217 * auVar22._24_4_ + auVar23._24_4_ * fVar215;
  auVar293._28_4_ = fVar236 + in_register_000015dc + in_register_0000159c;
  auVar211._0_4_ = fVar218 * auVar24._0_4_ + fVar216 * auVar25._0_4_ + auVar26._0_4_ * fVar197;
  auVar211._4_4_ = fVar237 * auVar24._4_4_ + fVar235 * auVar25._4_4_ + auVar26._4_4_ * fVar221;
  auVar211._8_4_ = fVar219 * auVar24._8_4_ + fVar217 * auVar25._8_4_ + auVar26._8_4_ * fVar215;
  auVar211._12_4_ = fVar239 * auVar24._12_4_ + fVar236 * auVar25._12_4_ + auVar26._12_4_ * fVar234;
  auVar211._16_4_ = fVar218 * auVar24._16_4_ + fVar216 * auVar25._16_4_ + auVar26._16_4_ * fVar197;
  auVar211._20_4_ = fVar237 * auVar24._20_4_ + fVar235 * auVar25._20_4_ + auVar26._20_4_ * fVar221;
  auVar211._24_4_ = fVar219 * auVar24._24_4_ + fVar217 * auVar25._24_4_ + auVar26._24_4_ * fVar215;
  auVar211._28_4_ = fVar239 + fVar236 + fVar234;
  auVar82 = vshufps_avx(auVar105,auVar105,0);
  auVar287 = vshufps_avx(auVar105,auVar105,0x55);
  auVar155 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar221 = auVar155._0_4_;
  fVar215 = auVar155._4_4_;
  fVar234 = auVar155._8_4_;
  fVar216 = auVar155._12_4_;
  fVar237 = auVar287._0_4_;
  fVar219 = auVar287._4_4_;
  fVar239 = auVar287._8_4_;
  fVar220 = auVar287._12_4_;
  fVar235 = auVar82._0_4_;
  fVar217 = auVar82._4_4_;
  fVar236 = auVar82._8_4_;
  fVar218 = auVar82._12_4_;
  fVar197 = auVar93._28_4_;
  auVar127._0_4_ = fVar235 * auVar93._0_4_ + fVar237 * auVar19._0_4_ + fVar221 * auVar20._0_4_;
  auVar127._4_4_ = fVar217 * auVar93._4_4_ + fVar219 * auVar19._4_4_ + fVar215 * auVar20._4_4_;
  auVar127._8_4_ = fVar236 * auVar93._8_4_ + fVar239 * auVar19._8_4_ + fVar234 * auVar20._8_4_;
  auVar127._12_4_ = fVar218 * auVar93._12_4_ + fVar220 * auVar19._12_4_ + fVar216 * auVar20._12_4_;
  auVar127._16_4_ = fVar235 * auVar93._16_4_ + fVar237 * auVar19._16_4_ + fVar221 * auVar20._16_4_;
  auVar127._20_4_ = fVar217 * auVar93._20_4_ + fVar219 * auVar19._20_4_ + fVar215 * auVar20._20_4_;
  auVar127._24_4_ = fVar236 * auVar93._24_4_ + fVar239 * auVar19._24_4_ + fVar234 * auVar20._24_4_;
  auVar127._28_4_ = fVar197 + auVar19._28_4_ + auVar20._28_4_;
  auVar157._0_4_ = fVar235 * auVar21._0_4_ + auVar23._0_4_ * fVar221 + fVar237 * auVar22._0_4_;
  auVar157._4_4_ = fVar217 * auVar21._4_4_ + auVar23._4_4_ * fVar215 + fVar219 * auVar22._4_4_;
  auVar157._8_4_ = fVar236 * auVar21._8_4_ + auVar23._8_4_ * fVar234 + fVar239 * auVar22._8_4_;
  auVar157._12_4_ = fVar218 * auVar21._12_4_ + auVar23._12_4_ * fVar216 + fVar220 * auVar22._12_4_;
  auVar157._16_4_ = fVar235 * auVar21._16_4_ + auVar23._16_4_ * fVar221 + fVar237 * auVar22._16_4_;
  auVar157._20_4_ = fVar217 * auVar21._20_4_ + auVar23._20_4_ * fVar215 + fVar219 * auVar22._20_4_;
  auVar157._24_4_ = fVar236 * auVar21._24_4_ + auVar23._24_4_ * fVar234 + fVar239 * auVar22._24_4_;
  auVar157._28_4_ = fVar197 + auVar23._28_4_ + auVar20._28_4_;
  auVar171._8_4_ = 0x7fffffff;
  auVar171._0_8_ = 0x7fffffff7fffffff;
  auVar171._12_4_ = 0x7fffffff;
  auVar171._16_4_ = 0x7fffffff;
  auVar171._20_4_ = 0x7fffffff;
  auVar171._24_4_ = 0x7fffffff;
  auVar171._28_4_ = 0x7fffffff;
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  auVar93 = vandps_avx(auVar303,auVar171);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar19 = vblendvps_avx(auVar303,auVar188,auVar93);
  auVar93 = vandps_avx(auVar293,auVar171);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar20 = vblendvps_avx(auVar293,auVar188,auVar93);
  auVar93 = vandps_avx(auVar211,auVar171);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar93 = vblendvps_avx(auVar211,auVar188,auVar93);
  auVar172._0_4_ = fVar235 * auVar24._0_4_ + fVar237 * auVar25._0_4_ + auVar26._0_4_ * fVar221;
  auVar172._4_4_ = fVar217 * auVar24._4_4_ + fVar219 * auVar25._4_4_ + auVar26._4_4_ * fVar215;
  auVar172._8_4_ = fVar236 * auVar24._8_4_ + fVar239 * auVar25._8_4_ + auVar26._8_4_ * fVar234;
  auVar172._12_4_ = fVar218 * auVar24._12_4_ + fVar220 * auVar25._12_4_ + auVar26._12_4_ * fVar216;
  auVar172._16_4_ = fVar235 * auVar24._16_4_ + fVar237 * auVar25._16_4_ + auVar26._16_4_ * fVar221;
  auVar172._20_4_ = fVar217 * auVar24._20_4_ + fVar219 * auVar25._20_4_ + auVar26._20_4_ * fVar215;
  auVar172._24_4_ = fVar236 * auVar24._24_4_ + fVar239 * auVar25._24_4_ + auVar26._24_4_ * fVar234;
  auVar172._28_4_ = fVar197 + auVar22._28_4_ + fVar216;
  auVar21 = vrcpps_avx(auVar19);
  fVar197 = auVar21._0_4_;
  fVar215 = auVar21._4_4_;
  auVar22._4_4_ = auVar19._4_4_ * fVar215;
  auVar22._0_4_ = auVar19._0_4_ * fVar197;
  fVar216 = auVar21._8_4_;
  auVar22._8_4_ = auVar19._8_4_ * fVar216;
  fVar217 = auVar21._12_4_;
  auVar22._12_4_ = auVar19._12_4_ * fVar217;
  fVar218 = auVar21._16_4_;
  auVar22._16_4_ = auVar19._16_4_ * fVar218;
  fVar219 = auVar21._20_4_;
  auVar22._20_4_ = auVar19._20_4_ * fVar219;
  fVar220 = auVar21._24_4_;
  auVar22._24_4_ = auVar19._24_4_ * fVar220;
  auVar22._28_4_ = auVar211._28_4_;
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = 0x3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar251._16_4_ = 0x3f800000;
  auVar251._20_4_ = 0x3f800000;
  auVar251._24_4_ = 0x3f800000;
  auVar251._28_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar251,auVar22);
  auVar19 = vrcpps_avx(auVar20);
  fVar197 = fVar197 + fVar197 * auVar22._0_4_;
  fVar215 = fVar215 + fVar215 * auVar22._4_4_;
  fVar216 = fVar216 + fVar216 * auVar22._8_4_;
  fVar217 = fVar217 + fVar217 * auVar22._12_4_;
  fVar218 = fVar218 + fVar218 * auVar22._16_4_;
  fVar219 = fVar219 + fVar219 * auVar22._20_4_;
  fVar220 = fVar220 + fVar220 * auVar22._24_4_;
  fVar221 = auVar19._0_4_;
  fVar234 = auVar19._4_4_;
  auVar23._4_4_ = auVar20._4_4_ * fVar234;
  auVar23._0_4_ = auVar20._0_4_ * fVar221;
  fVar235 = auVar19._8_4_;
  auVar23._8_4_ = auVar20._8_4_ * fVar235;
  fVar236 = auVar19._12_4_;
  auVar23._12_4_ = auVar20._12_4_ * fVar236;
  fVar237 = auVar19._16_4_;
  auVar23._16_4_ = auVar20._16_4_ * fVar237;
  fVar239 = auVar19._20_4_;
  auVar23._20_4_ = auVar20._20_4_ * fVar239;
  fVar240 = auVar19._24_4_;
  auVar23._24_4_ = auVar20._24_4_ * fVar240;
  auVar23._28_4_ = auVar21._28_4_;
  auVar19 = vsubps_avx(auVar251,auVar23);
  fVar221 = fVar221 + fVar221 * auVar19._0_4_;
  fVar234 = fVar234 + fVar234 * auVar19._4_4_;
  fVar235 = fVar235 + fVar235 * auVar19._8_4_;
  fVar236 = fVar236 + fVar236 * auVar19._12_4_;
  fVar237 = fVar237 + fVar237 * auVar19._16_4_;
  fVar239 = fVar239 + fVar239 * auVar19._20_4_;
  fVar240 = fVar240 + fVar240 * auVar19._24_4_;
  auVar19 = vrcpps_avx(auVar93);
  fVar174 = auVar19._0_4_;
  fVar191 = auVar19._4_4_;
  auVar20._4_4_ = fVar191 * auVar93._4_4_;
  auVar20._0_4_ = fVar174 * auVar93._0_4_;
  fVar192 = auVar19._8_4_;
  auVar20._8_4_ = fVar192 * auVar93._8_4_;
  fVar193 = auVar19._12_4_;
  auVar20._12_4_ = fVar193 * auVar93._12_4_;
  fVar194 = auVar19._16_4_;
  auVar20._16_4_ = fVar194 * auVar93._16_4_;
  fVar195 = auVar19._20_4_;
  auVar20._20_4_ = fVar195 * auVar93._20_4_;
  fVar196 = auVar19._24_4_;
  auVar20._24_4_ = fVar196 * auVar93._24_4_;
  auVar20._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(auVar251,auVar20);
  fVar174 = fVar174 + fVar174 * auVar93._0_4_;
  fVar191 = fVar191 + fVar191 * auVar93._4_4_;
  fVar192 = fVar192 + fVar192 * auVar93._8_4_;
  fVar193 = fVar193 + fVar193 * auVar93._12_4_;
  fVar194 = fVar194 + fVar194 * auVar93._16_4_;
  fVar195 = fVar195 + fVar195 * auVar93._20_4_;
  fVar196 = fVar196 + fVar196 * auVar93._24_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = *(ulong *)(prim + uVar75 * 7 + 0xe);
  auVar287 = vpmovsxwd_avx(auVar287);
  auVar94._16_16_ = auVar287;
  auVar94._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar94);
  auVar93 = vsubps_avx(auVar93,auVar127);
  auVar76._0_4_ = fVar197 * auVar93._0_4_;
  auVar76._4_4_ = fVar215 * auVar93._4_4_;
  auVar76._8_4_ = fVar216 * auVar93._8_4_;
  auVar76._12_4_ = fVar217 * auVar93._12_4_;
  auVar21._16_4_ = fVar218 * auVar93._16_4_;
  auVar21._0_16_ = auVar76;
  auVar21._20_4_ = fVar219 * auVar93._20_4_;
  auVar21._24_4_ = fVar220 * auVar93._24_4_;
  auVar21._28_4_ = auVar93._28_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + lVar18 + 6);
  auVar82 = vpmovsxwd_avx(auVar155);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar18 + 0xe);
  auVar287 = vpmovsxwd_avx(auVar8);
  auVar252._16_16_ = auVar287;
  auVar252._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar252);
  auVar93 = vsubps_avx(auVar93,auVar127);
  auVar106._0_4_ = fVar197 * auVar93._0_4_;
  auVar106._4_4_ = fVar215 * auVar93._4_4_;
  auVar106._8_4_ = fVar216 * auVar93._8_4_;
  auVar106._12_4_ = fVar217 * auVar93._12_4_;
  auVar24._16_4_ = fVar218 * auVar93._16_4_;
  auVar24._0_16_ = auVar106;
  auVar24._20_4_ = fVar219 * auVar93._20_4_;
  auVar24._24_4_ = fVar220 * auVar93._24_4_;
  auVar24._28_4_ = auVar93._28_4_;
  lVar73 = (ulong)(byte)PVar12 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar73 + 6);
  auVar82 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar73 + 0xe);
  auVar287 = vpmovsxwd_avx(auVar10);
  lVar73 = lVar73 + uVar75 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar73 + 6);
  auVar155 = vpmovsxwd_avx(auVar11);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + lVar73 + 0xe);
  auVar8 = vpmovsxwd_avx(auVar123);
  auVar212._16_16_ = auVar8;
  auVar212._0_16_ = auVar155;
  auVar93 = vcvtdq2ps_avx(auVar212);
  auVar93 = vsubps_avx(auVar93,auVar157);
  auVar199._0_4_ = fVar221 * auVar93._0_4_;
  auVar199._4_4_ = fVar234 * auVar93._4_4_;
  auVar199._8_4_ = fVar235 * auVar93._8_4_;
  auVar199._12_4_ = fVar236 * auVar93._12_4_;
  auVar25._16_4_ = fVar237 * auVar93._16_4_;
  auVar25._0_16_ = auVar199;
  auVar25._20_4_ = fVar239 * auVar93._20_4_;
  auVar25._24_4_ = fVar240 * auVar93._24_4_;
  auVar25._28_4_ = auVar93._28_4_;
  auVar253._16_16_ = auVar287;
  auVar253._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar253);
  auVar93 = vsubps_avx(auVar93,auVar157);
  auVar135._0_4_ = fVar221 * auVar93._0_4_;
  auVar135._4_4_ = fVar234 * auVar93._4_4_;
  auVar135._8_4_ = fVar235 * auVar93._8_4_;
  auVar135._12_4_ = fVar236 * auVar93._12_4_;
  auVar26._16_4_ = fVar237 * auVar93._16_4_;
  auVar26._0_16_ = auVar135;
  auVar26._20_4_ = fVar239 * auVar93._20_4_;
  auVar26._24_4_ = fVar240 * auVar93._24_4_;
  auVar26._28_4_ = auVar93._28_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar72 + uVar75 + 6);
  auVar82 = vpmovsxwd_avx(auVar111);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar72 + uVar75 + 0xe);
  auVar287 = vpmovsxwd_avx(auVar141);
  auVar232._16_16_ = auVar287;
  auVar232._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar232);
  auVar93 = vsubps_avx(auVar93,auVar172);
  auVar222._0_4_ = fVar174 * auVar93._0_4_;
  auVar222._4_4_ = fVar191 * auVar93._4_4_;
  auVar222._8_4_ = fVar192 * auVar93._8_4_;
  auVar222._12_4_ = fVar193 * auVar93._12_4_;
  auVar27._16_4_ = fVar194 * auVar93._16_4_;
  auVar27._0_16_ = auVar222;
  auVar27._20_4_ = fVar195 * auVar93._20_4_;
  auVar27._24_4_ = fVar196 * auVar93._24_4_;
  auVar27._28_4_ = auVar93._28_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 6);
  auVar82 = vpmovsxwd_avx(auVar112);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 0xe);
  auVar287 = vpmovsxwd_avx(auVar238);
  auVar254._16_16_ = auVar287;
  auVar254._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar254);
  auVar93 = vsubps_avx(auVar93,auVar172);
  auVar162._0_4_ = fVar174 * auVar93._0_4_;
  auVar162._4_4_ = fVar191 * auVar93._4_4_;
  auVar162._8_4_ = fVar192 * auVar93._8_4_;
  auVar162._12_4_ = fVar193 * auVar93._12_4_;
  auVar28._16_4_ = fVar194 * auVar93._16_4_;
  auVar28._0_16_ = auVar162;
  auVar28._20_4_ = fVar195 * auVar93._20_4_;
  auVar28._24_4_ = fVar196 * auVar93._24_4_;
  auVar28._28_4_ = auVar93._28_4_;
  auVar82 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
  auVar287 = vpminsd_avx(auVar76,auVar106);
  auVar283._16_16_ = auVar82;
  auVar283._0_16_ = auVar287;
  auVar82 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar287 = vpminsd_avx(auVar199,auVar135);
  auVar294._16_16_ = auVar82;
  auVar294._0_16_ = auVar287;
  auVar93 = vmaxps_avx(auVar283,auVar294);
  auVar82 = vpminsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar287 = vpminsd_avx(auVar222,auVar162);
  auVar315._16_16_ = auVar82;
  auVar315._0_16_ = auVar287;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar326._4_4_ = uVar6;
  auVar326._0_4_ = uVar6;
  auVar326._8_4_ = uVar6;
  auVar326._12_4_ = uVar6;
  auVar326._16_4_ = uVar6;
  auVar326._20_4_ = uVar6;
  auVar326._24_4_ = uVar6;
  auVar326._28_4_ = uVar6;
  auVar19 = vmaxps_avx(auVar315,auVar326);
  auVar93 = vmaxps_avx(auVar93,auVar19);
  local_2c0._4_4_ = auVar93._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar93._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar93._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar93._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar93._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar93._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar93._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar93._28_4_;
  auVar82 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
  auVar287 = vpmaxsd_avx(auVar76,auVar106);
  auVar95._16_16_ = auVar82;
  auVar95._0_16_ = auVar287;
  auVar82 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar287 = vpmaxsd_avx(auVar199,auVar135);
  auVar128._16_16_ = auVar82;
  auVar128._0_16_ = auVar287;
  auVar93 = vminps_avx(auVar95,auVar128);
  auVar82 = vpmaxsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar287 = vpmaxsd_avx(auVar222,auVar162);
  auVar129._16_16_ = auVar82;
  auVar129._0_16_ = auVar287;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar158._4_4_ = uVar6;
  auVar158._0_4_ = uVar6;
  auVar158._8_4_ = uVar6;
  auVar158._12_4_ = uVar6;
  auVar158._16_4_ = uVar6;
  auVar158._20_4_ = uVar6;
  auVar158._24_4_ = uVar6;
  auVar158._28_4_ = uVar6;
  auVar19 = vminps_avx(auVar129,auVar158);
  auVar93 = vminps_avx(auVar93,auVar19);
  auVar19._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar93._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar93._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar93._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar93._28_4_;
  auVar93 = vcmpps_avx(local_2c0,auVar19,2);
  auVar82 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar130._16_16_ = auVar82;
  auVar130._0_16_ = auVar82;
  auVar19 = vcvtdq2ps_avx(auVar130);
  auVar19 = vcmpps_avx(_DAT_01faff40,auVar19,1);
  auVar93 = vandps_avx(auVar93,auVar19);
  uVar67 = vmovmskps_avx(auVar93);
  if (uVar67 == 0) {
    return;
  }
  uVar67 = uVar67 & 0xff;
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  uVar70 = 1 << ((byte)k & 0x1f);
  do {
    uVar75 = (ulong)uVar67;
    lVar73 = 0;
    if (uVar75 != 0) {
      for (; (uVar67 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
      }
    }
    uVar67 = *(uint *)(prim + 2);
    uVar13 = *(uint *)(prim + lVar73 * 4 + 6);
    pGVar14 = (context->scene->geometries).items[uVar67].ptr;
    uVar72 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar13);
    p_Var15 = pGVar14[1].intersectionFilterN;
    pvVar16 = pGVar14[2].userPtr;
    _Var17 = pGVar14[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    pfVar1 = (float *)(_Var17 + uVar72 * (long)pvVar16);
    fVar197 = *pfVar1;
    fVar221 = pfVar1[1];
    fVar215 = pfVar1[2];
    fVar234 = pfVar1[3];
    pfVar1 = (float *)(_Var17 + (uVar72 + 1) * (long)pvVar16);
    pfVar2 = (float *)(_Var17 + (uVar72 + 2) * (long)pvVar16);
    pfVar3 = (float *)(_Var17 + (long)pvVar16 * (uVar72 + 3));
    fVar216 = *pfVar3;
    fVar235 = pfVar3[1];
    fVar217 = pfVar3[2];
    fVar236 = pfVar3[3];
    uVar75 = uVar75 - 1 & uVar75;
    lVar73 = *(long *)&pGVar14[1].time_range.upper;
    pfVar3 = (float *)(lVar73 + (long)p_Var15 * uVar72);
    fVar218 = *pfVar3;
    fVar237 = pfVar3[1];
    fVar219 = pfVar3[2];
    fVar239 = pfVar3[3];
    pfVar3 = (float *)(lVar73 + (long)p_Var15 * (uVar72 + 1));
    pfVar4 = (float *)(lVar73 + (long)p_Var15 * (uVar72 + 2));
    lVar18 = 0;
    if (uVar75 != 0) {
      for (; (uVar75 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
      }
    }
    pfVar5 = (float *)(lVar73 + (long)p_Var15 * (uVar72 + 3));
    fVar220 = *pfVar5;
    fVar240 = pfVar5[1];
    fVar174 = pfVar5[2];
    fVar191 = pfVar5[3];
    if (((uVar75 != 0) && (uVar72 = uVar75 - 1 & uVar75, uVar72 != 0)) && (lVar73 = 0, uVar72 != 0))
    {
      for (; (uVar72 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
      }
    }
    auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar155 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    fVar192 = *pfVar4 * 0.0;
    fVar193 = pfVar4[1] * 0.0;
    fVar194 = pfVar4[2] * 0.0;
    fVar195 = pfVar4[3] * 0.0;
    fVar196 = fVar192 + fVar220 * 0.0;
    fVar297 = fVar193 + fVar240 * 0.0;
    fVar298 = fVar194 + fVar174 * 0.0;
    fVar299 = fVar195 + fVar191 * 0.0;
    fVar300 = *pfVar3 * 0.0;
    fVar305 = pfVar3[1] * 0.0;
    fVar306 = pfVar3[2] * 0.0;
    fVar307 = pfVar3[3] * 0.0;
    local_6f0._0_4_ = fVar218 + fVar300 + fVar196;
    local_6f0._4_4_ = fVar237 + fVar305 + fVar297;
    fStack_6e8 = fVar219 + fVar306 + fVar298;
    fStack_6e4 = fVar239 + fVar307 + fVar299;
    auVar136._0_4_ = fVar196 + *pfVar3 * 3.0;
    auVar136._4_4_ = fVar297 + pfVar3[1] * 3.0;
    auVar136._8_4_ = fVar298 + pfVar3[2] * 3.0;
    auVar136._12_4_ = fVar299 + pfVar3[3] * 3.0;
    auVar285._0_4_ = fVar218 * 3.0;
    auVar285._4_4_ = fVar237 * 3.0;
    auVar285._8_4_ = fVar219 * 3.0;
    auVar285._12_4_ = fVar239 * 3.0;
    auVar111 = vsubps_avx(auVar136,auVar285);
    fVar312 = *pfVar2 * 0.0;
    fVar316 = pfVar2[1] * 0.0;
    fVar317 = pfVar2[2] * 0.0;
    fVar318 = pfVar2[3] * 0.0;
    fVar196 = fVar312 + fVar216 * 0.0;
    fVar297 = fVar316 + fVar235 * 0.0;
    fVar298 = fVar317 + fVar217 * 0.0;
    fVar299 = fVar318 + fVar236 * 0.0;
    fVar320 = *pfVar1 * 0.0;
    fVar328 = pfVar1[1] * 0.0;
    fVar329 = pfVar1[2] * 0.0;
    fVar330 = pfVar1[3] * 0.0;
    auVar331._0_4_ = fVar320 + fVar196 + fVar197;
    auVar331._4_4_ = fVar328 + fVar297 + fVar221;
    auVar331._8_4_ = fVar329 + fVar298 + fVar215;
    auVar331._12_4_ = fVar330 + fVar299 + fVar234;
    auVar163._0_4_ = fVar196 + *pfVar1 * 3.0;
    auVar163._4_4_ = fVar297 + pfVar1[1] * 3.0;
    auVar163._8_4_ = fVar298 + pfVar1[2] * 3.0;
    auVar163._12_4_ = fVar299 + pfVar1[3] * 3.0;
    auVar286._0_4_ = fVar197 * 3.0;
    auVar286._4_4_ = fVar221 * 3.0;
    auVar286._8_4_ = fVar215 * 3.0;
    auVar286._12_4_ = fVar234 * 3.0;
    auVar9 = vsubps_avx(auVar163,auVar286);
    auVar256._0_4_ = fVar218 * 0.0;
    auVar256._4_4_ = fVar237 * 0.0;
    auVar256._8_4_ = fVar219 * 0.0;
    auVar256._12_4_ = fVar239 * 0.0;
    auVar164._0_4_ = auVar256._0_4_ + fVar300 + fVar192 + fVar220;
    auVar164._4_4_ = auVar256._4_4_ + fVar305 + fVar193 + fVar240;
    auVar164._8_4_ = auVar256._8_4_ + fVar306 + fVar194 + fVar174;
    auVar164._12_4_ = auVar256._12_4_ + fVar307 + fVar195 + fVar191;
    auVar262._0_4_ = fVar220 * 3.0;
    auVar262._4_4_ = fVar240 * 3.0;
    auVar262._8_4_ = fVar174 * 3.0;
    auVar262._12_4_ = fVar191 * 3.0;
    auVar175._0_4_ = *pfVar4 * 3.0;
    auVar175._4_4_ = pfVar4[1] * 3.0;
    auVar175._8_4_ = pfVar4[2] * 3.0;
    auVar175._12_4_ = pfVar4[3] * 3.0;
    auVar82 = vsubps_avx(auVar262,auVar175);
    auVar176._0_4_ = fVar300 + auVar82._0_4_;
    auVar176._4_4_ = fVar305 + auVar82._4_4_;
    auVar176._8_4_ = fVar306 + auVar82._8_4_;
    auVar176._12_4_ = fVar307 + auVar82._12_4_;
    auVar141 = vsubps_avx(auVar176,auVar256);
    auVar200._0_4_ = fVar197 * 0.0;
    auVar200._4_4_ = fVar221 * 0.0;
    auVar200._8_4_ = fVar215 * 0.0;
    auVar200._12_4_ = fVar234 * 0.0;
    auVar263._0_4_ = fVar320 + fVar312 + fVar216 + auVar200._0_4_;
    auVar263._4_4_ = fVar328 + fVar316 + fVar235 + auVar200._4_4_;
    auVar263._8_4_ = fVar329 + fVar317 + fVar217 + auVar200._8_4_;
    auVar263._12_4_ = fVar330 + fVar318 + fVar236 + auVar200._12_4_;
    auVar241._0_4_ = fVar216 * 3.0;
    auVar241._4_4_ = fVar235 * 3.0;
    auVar241._8_4_ = fVar217 * 3.0;
    auVar241._12_4_ = fVar236 * 3.0;
    auVar223._0_4_ = *pfVar2 * 3.0;
    auVar223._4_4_ = pfVar2[1] * 3.0;
    auVar223._8_4_ = pfVar2[2] * 3.0;
    auVar223._12_4_ = pfVar2[3] * 3.0;
    auVar82 = vsubps_avx(auVar241,auVar223);
    auVar224._0_4_ = fVar320 + auVar82._0_4_;
    auVar224._4_4_ = fVar328 + auVar82._4_4_;
    auVar224._8_4_ = fVar329 + auVar82._8_4_;
    auVar224._12_4_ = fVar330 + auVar82._12_4_;
    auVar11 = vsubps_avx(auVar224,auVar200);
    auVar82 = vshufps_avx(auVar111,auVar111,0xc9);
    auVar287 = vshufps_avx(auVar331,auVar331,0xc9);
    fVar192 = auVar111._0_4_;
    auVar242._0_4_ = fVar192 * auVar287._0_4_;
    fVar193 = auVar111._4_4_;
    auVar242._4_4_ = fVar193 * auVar287._4_4_;
    fVar194 = auVar111._8_4_;
    auVar242._8_4_ = fVar194 * auVar287._8_4_;
    fVar195 = auVar111._12_4_;
    auVar242._12_4_ = fVar195 * auVar287._12_4_;
    auVar257._0_4_ = auVar331._0_4_ * auVar82._0_4_;
    auVar257._4_4_ = auVar331._4_4_ * auVar82._4_4_;
    auVar257._8_4_ = auVar331._8_4_ * auVar82._8_4_;
    auVar257._12_4_ = auVar331._12_4_ * auVar82._12_4_;
    auVar287 = vsubps_avx(auVar257,auVar242);
    auVar8 = vshufps_avx(auVar287,auVar287,0xc9);
    auVar287 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar243._0_4_ = fVar192 * auVar287._0_4_;
    auVar243._4_4_ = fVar193 * auVar287._4_4_;
    auVar243._8_4_ = fVar194 * auVar287._8_4_;
    auVar243._12_4_ = fVar195 * auVar287._12_4_;
    auVar201._0_4_ = auVar9._0_4_ * auVar82._0_4_;
    auVar201._4_4_ = auVar9._4_4_ * auVar82._4_4_;
    auVar201._8_4_ = auVar9._8_4_ * auVar82._8_4_;
    auVar201._12_4_ = auVar9._12_4_ * auVar82._12_4_;
    auVar82 = vsubps_avx(auVar201,auVar243);
    auVar9 = vshufps_avx(auVar82,auVar82,0xc9);
    auVar82 = vshufps_avx(auVar141,auVar141,0xc9);
    auVar287 = vshufps_avx(auVar263,auVar263,0xc9);
    fVar196 = auVar141._0_4_;
    auVar202._0_4_ = fVar196 * auVar287._0_4_;
    fVar297 = auVar141._4_4_;
    auVar202._4_4_ = fVar297 * auVar287._4_4_;
    fVar298 = auVar141._8_4_;
    auVar202._8_4_ = fVar298 * auVar287._8_4_;
    fVar299 = auVar141._12_4_;
    auVar202._12_4_ = fVar299 * auVar287._12_4_;
    auVar264._0_4_ = auVar263._0_4_ * auVar82._0_4_;
    auVar264._4_4_ = auVar263._4_4_ * auVar82._4_4_;
    auVar264._8_4_ = auVar263._8_4_ * auVar82._8_4_;
    auVar264._12_4_ = auVar263._12_4_ * auVar82._12_4_;
    auVar287 = vsubps_avx(auVar264,auVar202);
    auVar10 = vshufps_avx(auVar287,auVar287,0xc9);
    auVar287 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar265._0_4_ = auVar287._0_4_ * fVar196;
    auVar265._4_4_ = auVar287._4_4_ * fVar297;
    auVar265._8_4_ = auVar287._8_4_ * fVar298;
    auVar265._12_4_ = auVar287._12_4_ * fVar299;
    auVar225._0_4_ = auVar82._0_4_ * auVar11._0_4_;
    auVar225._4_4_ = auVar82._4_4_ * auVar11._4_4_;
    auVar225._8_4_ = auVar82._8_4_ * auVar11._8_4_;
    auVar225._12_4_ = auVar82._12_4_ * auVar11._12_4_;
    auVar82 = vsubps_avx(auVar225,auVar265);
    auVar11 = vshufps_avx(auVar82,auVar82,0xc9);
    auVar82 = vdpps_avx(auVar8,auVar8,0x7f);
    fVar216 = auVar82._0_4_;
    auVar238 = ZEXT416((uint)fVar216);
    auVar287 = vrsqrtss_avx(auVar238,auVar238);
    fVar197 = auVar287._0_4_;
    auVar287 = vdpps_avx(auVar8,auVar9,0x7f);
    auVar123 = ZEXT416((uint)(fVar197 * 1.5 - fVar216 * 0.5 * fVar197 * fVar197 * fVar197));
    auVar123 = vshufps_avx(auVar123,auVar123,0);
    fVar197 = auVar8._0_4_ * auVar123._0_4_;
    fVar221 = auVar8._4_4_ * auVar123._4_4_;
    fVar215 = auVar8._8_4_ * auVar123._8_4_;
    fVar234 = auVar8._12_4_ * auVar123._12_4_;
    auVar82 = vshufps_avx(auVar82,auVar82,0);
    auVar278._0_4_ = auVar9._0_4_ * auVar82._0_4_;
    auVar278._4_4_ = auVar9._4_4_ * auVar82._4_4_;
    auVar278._8_4_ = auVar9._8_4_ * auVar82._8_4_;
    auVar278._12_4_ = auVar9._12_4_ * auVar82._12_4_;
    auVar82 = vshufps_avx(auVar287,auVar287,0);
    auVar258._0_4_ = auVar8._0_4_ * auVar82._0_4_;
    auVar258._4_4_ = auVar8._4_4_ * auVar82._4_4_;
    auVar258._8_4_ = auVar8._8_4_ * auVar82._8_4_;
    auVar258._12_4_ = auVar8._12_4_ * auVar82._12_4_;
    auVar112 = vsubps_avx(auVar278,auVar258);
    auVar82 = vrcpss_avx(auVar238,auVar238);
    auVar82 = ZEXT416((uint)(auVar82._0_4_ * (2.0 - fVar216 * auVar82._0_4_)));
    auVar8 = vshufps_avx(auVar82,auVar82,0);
    auVar82 = vdpps_avx(auVar10,auVar10,0x7f);
    fVar216 = auVar82._0_4_;
    auVar238 = ZEXT416((uint)fVar216);
    auVar287 = vrsqrtss_avx(auVar238,auVar238);
    fVar235 = auVar287._0_4_;
    auVar287 = ZEXT416((uint)(fVar235 * 1.5 - fVar216 * 0.5 * fVar235 * fVar235 * fVar235));
    auVar9 = vshufps_avx(auVar287,auVar287,0);
    fVar235 = auVar9._0_4_ * auVar10._0_4_;
    fVar217 = auVar9._4_4_ * auVar10._4_4_;
    fVar236 = auVar9._8_4_ * auVar10._8_4_;
    fVar218 = auVar9._12_4_ * auVar10._12_4_;
    auVar287 = vdpps_avx(auVar10,auVar11,0x7f);
    auVar82 = vshufps_avx(auVar82,auVar82,0);
    auVar244._0_4_ = auVar82._0_4_ * auVar11._0_4_;
    auVar244._4_4_ = auVar82._4_4_ * auVar11._4_4_;
    auVar244._8_4_ = auVar82._8_4_ * auVar11._8_4_;
    auVar244._12_4_ = auVar82._12_4_ * auVar11._12_4_;
    auVar82 = vshufps_avx(auVar287,auVar287,0);
    auVar203._0_4_ = auVar82._0_4_ * auVar10._0_4_;
    auVar203._4_4_ = auVar82._4_4_ * auVar10._4_4_;
    auVar203._8_4_ = auVar82._8_4_ * auVar10._8_4_;
    auVar203._12_4_ = auVar82._12_4_ * auVar10._12_4_;
    auVar11 = vsubps_avx(auVar244,auVar203);
    auVar82 = vrcpss_avx(auVar238,auVar238);
    auVar82 = ZEXT416((uint)((2.0 - fVar216 * auVar82._0_4_) * auVar82._0_4_));
    auVar82 = vshufps_avx(auVar82,auVar82,0);
    auVar287 = vshufps_avx(_local_6f0,_local_6f0,0xff);
    auVar266._0_4_ = auVar287._0_4_ * fVar197;
    auVar266._4_4_ = auVar287._4_4_ * fVar221;
    auVar266._8_4_ = auVar287._8_4_ * fVar215;
    auVar266._12_4_ = auVar287._12_4_ * fVar234;
    _local_4a0 = vsubps_avx(_local_6f0,auVar266);
    auVar10 = vshufps_avx(auVar111,auVar111,0xff);
    auVar226._0_4_ =
         auVar10._0_4_ * fVar197 + auVar123._0_4_ * auVar112._0_4_ * auVar8._0_4_ * auVar287._0_4_;
    auVar226._4_4_ =
         auVar10._4_4_ * fVar221 + auVar123._4_4_ * auVar112._4_4_ * auVar8._4_4_ * auVar287._4_4_;
    auVar226._8_4_ =
         auVar10._8_4_ * fVar215 + auVar123._8_4_ * auVar112._8_4_ * auVar8._8_4_ * auVar287._8_4_;
    auVar226._12_4_ =
         auVar10._12_4_ * fVar234 +
         auVar123._12_4_ * auVar112._12_4_ * auVar8._12_4_ * auVar287._12_4_;
    auVar10 = vsubps_avx(auVar111,auVar226);
    local_4b0._0_4_ = auVar266._0_4_ + (float)local_6f0._0_4_;
    local_4b0._4_4_ = auVar266._4_4_ + (float)local_6f0._4_4_;
    fStack_4a8 = auVar266._8_4_ + fStack_6e8;
    fStack_4a4 = auVar266._12_4_ + fStack_6e4;
    auVar287 = vshufps_avx(auVar164,auVar164,0xff);
    auVar137._0_4_ = fVar235 * auVar287._0_4_;
    auVar137._4_4_ = fVar217 * auVar287._4_4_;
    auVar137._8_4_ = fVar236 * auVar287._8_4_;
    auVar137._12_4_ = fVar218 * auVar287._12_4_;
    _local_4c0 = vsubps_avx(auVar164,auVar137);
    auVar8 = vshufps_avx(auVar141,auVar141,0xff);
    auVar107._0_4_ =
         fVar235 * auVar8._0_4_ + auVar287._0_4_ * auVar9._0_4_ * auVar11._0_4_ * auVar82._0_4_;
    auVar107._4_4_ =
         fVar217 * auVar8._4_4_ + auVar287._4_4_ * auVar9._4_4_ * auVar11._4_4_ * auVar82._4_4_;
    auVar107._8_4_ =
         fVar236 * auVar8._8_4_ + auVar287._8_4_ * auVar9._8_4_ * auVar11._8_4_ * auVar82._8_4_;
    auVar107._12_4_ =
         fVar218 * auVar8._12_4_ + auVar287._12_4_ * auVar9._12_4_ * auVar11._12_4_ * auVar82._12_4_
    ;
    auVar9 = vsubps_avx(auVar141,auVar107);
    local_4d0._0_4_ = auVar164._0_4_ + auVar137._0_4_;
    local_4d0._4_4_ = auVar164._4_4_ + auVar137._4_4_;
    fStack_4c8 = auVar164._8_4_ + auVar137._8_4_;
    fStack_4c4 = auVar164._12_4_ + auVar137._12_4_;
    local_4e0._0_4_ = local_4a0._0_4_ + auVar10._0_4_ * 0.33333334;
    local_4e0._4_4_ = local_4a0._4_4_ + auVar10._4_4_ * 0.33333334;
    fStack_4d8 = local_4a0._8_4_ + auVar10._8_4_ * 0.33333334;
    fStack_4d4 = local_4a0._12_4_ + auVar10._12_4_ * 0.33333334;
    local_3b0 = vsubps_avx(_local_4a0,auVar155);
    auVar287 = vmovsldup_avx(local_3b0);
    auVar82 = vmovshdup_avx(local_3b0);
    auVar8 = vshufps_avx(local_3b0,local_3b0,0xaa);
    fVar197 = pre->ray_space[k].vx.field_0.m128[0];
    fVar221 = pre->ray_space[k].vx.field_0.m128[1];
    fVar215 = pre->ray_space[k].vx.field_0.m128[2];
    fVar234 = pre->ray_space[k].vx.field_0.m128[3];
    fVar216 = pre->ray_space[k].vy.field_0.m128[0];
    fVar235 = pre->ray_space[k].vy.field_0.m128[1];
    fVar217 = pre->ray_space[k].vy.field_0.m128[2];
    fVar236 = pre->ray_space[k].vy.field_0.m128[3];
    fVar218 = pre->ray_space[k].vz.field_0.m128[0];
    fVar237 = pre->ray_space[k].vz.field_0.m128[1];
    fVar219 = pre->ray_space[k].vz.field_0.m128[2];
    fVar239 = pre->ray_space[k].vz.field_0.m128[3];
    fVar220 = fVar197 * auVar287._0_4_ + auVar8._0_4_ * fVar218 + fVar216 * auVar82._0_4_;
    fVar174 = fVar221 * auVar287._4_4_ + auVar8._4_4_ * fVar237 + fVar235 * auVar82._4_4_;
    local_6f0._4_4_ = fVar174;
    local_6f0._0_4_ = fVar220;
    fStack_6e8 = fVar215 * auVar287._8_4_ + auVar8._8_4_ * fVar219 + fVar217 * auVar82._8_4_;
    fStack_6e4 = fVar234 * auVar287._12_4_ + auVar8._12_4_ * fVar239 + fVar236 * auVar82._12_4_;
    local_3c0 = vsubps_avx(_local_4e0,auVar155);
    auVar8 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar82 = vmovshdup_avx(local_3c0);
    auVar287 = vmovsldup_avx(local_3c0);
    fVar240 = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + fVar218 * auVar8._0_4_;
    fVar191 = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + fVar237 * auVar8._4_4_;
    local_5b0._4_4_ = fVar191;
    local_5b0._0_4_ = fVar240;
    fStack_5a8 = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + fVar219 * auVar8._8_4_;
    fStack_5a4 = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + fVar239 * auVar8._12_4_;
    auVar204._0_4_ = auVar9._0_4_ * 0.33333334;
    auVar204._4_4_ = auVar9._4_4_ * 0.33333334;
    auVar204._8_4_ = auVar9._8_4_ * 0.33333334;
    auVar204._12_4_ = auVar9._12_4_ * 0.33333334;
    _local_4f0 = vsubps_avx(_local_4c0,auVar204);
    local_3d0 = vsubps_avx(_local_4f0,auVar155);
    auVar8 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar82 = vmovshdup_avx(local_3d0);
    auVar287 = vmovsldup_avx(local_3d0);
    auVar332._0_4_ = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + fVar218 * auVar8._0_4_;
    auVar332._4_4_ = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + fVar237 * auVar8._4_4_;
    auVar332._8_4_ = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + fVar219 * auVar8._8_4_;
    auVar332._12_4_ = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + fVar239 * auVar8._12_4_
    ;
    local_3e0 = vsubps_avx(_local_4c0,auVar155);
    auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar82 = vmovshdup_avx(local_3e0);
    auVar287 = vmovsldup_avx(local_3e0);
    auVar321._0_4_ = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + auVar8._0_4_ * fVar218;
    auVar321._4_4_ = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + auVar8._4_4_ * fVar237;
    auVar321._8_4_ = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + auVar8._8_4_ * fVar219;
    auVar321._12_4_ = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + auVar8._12_4_ * fVar239
    ;
    local_3f0 = vsubps_avx(_local_4b0,auVar155);
    auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar82 = vmovshdup_avx(local_3f0);
    auVar287 = vmovsldup_avx(local_3f0);
    auVar313._0_4_ = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + auVar8._0_4_ * fVar218;
    auVar313._4_4_ = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + auVar8._4_4_ * fVar237;
    auVar313._8_4_ = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + auVar8._8_4_ * fVar219;
    auVar313._12_4_ = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + auVar8._12_4_ * fVar239
    ;
    local_500._0_4_ = (fVar192 + auVar226._0_4_) * 0.33333334 + (float)local_4b0._0_4_;
    local_500._4_4_ = (fVar193 + auVar226._4_4_) * 0.33333334 + (float)local_4b0._4_4_;
    fStack_4f8 = (fVar194 + auVar226._8_4_) * 0.33333334 + fStack_4a8;
    fStack_4f4 = (fVar195 + auVar226._12_4_) * 0.33333334 + fStack_4a4;
    local_400 = vsubps_avx(_local_500,auVar155);
    auVar8 = vshufps_avx(local_400,local_400,0xaa);
    auVar82 = vmovshdup_avx(local_400);
    auVar287 = vmovsldup_avx(local_400);
    auVar267._0_4_ = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + auVar8._0_4_ * fVar218;
    auVar267._4_4_ = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + auVar8._4_4_ * fVar237;
    auVar267._8_4_ = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + auVar8._8_4_ * fVar219;
    auVar267._12_4_ = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + auVar8._12_4_ * fVar239
    ;
    auVar245._0_4_ = (fVar196 + auVar107._0_4_) * 0.33333334;
    auVar245._4_4_ = (fVar297 + auVar107._4_4_) * 0.33333334;
    auVar245._8_4_ = (fVar298 + auVar107._8_4_) * 0.33333334;
    auVar245._12_4_ = (fVar299 + auVar107._12_4_) * 0.33333334;
    _local_440 = vsubps_avx(_local_4d0,auVar245);
    local_410 = vsubps_avx(_local_440,auVar155);
    auVar8 = vshufps_avx(local_410,local_410,0xaa);
    auVar82 = vmovshdup_avx(local_410);
    auVar287 = vmovsldup_avx(local_410);
    auVar108._0_4_ = auVar287._0_4_ * fVar197 + auVar82._0_4_ * fVar216 + fVar218 * auVar8._0_4_;
    auVar108._4_4_ = auVar287._4_4_ * fVar221 + auVar82._4_4_ * fVar235 + fVar237 * auVar8._4_4_;
    auVar108._8_4_ = auVar287._8_4_ * fVar215 + auVar82._8_4_ * fVar217 + fVar219 * auVar8._8_4_;
    auVar108._12_4_ = auVar287._12_4_ * fVar234 + auVar82._12_4_ * fVar236 + fVar239 * auVar8._12_4_
    ;
    local_420 = vsubps_avx(_local_4d0,auVar155);
    auVar155 = vshufps_avx(local_420,local_420,0xaa);
    auVar82 = vmovshdup_avx(local_420);
    auVar287 = vmovsldup_avx(local_420);
    auVar77._0_4_ = fVar197 * auVar287._0_4_ + fVar216 * auVar82._0_4_ + fVar218 * auVar155._0_4_;
    auVar77._4_4_ = fVar221 * auVar287._4_4_ + fVar235 * auVar82._4_4_ + fVar237 * auVar155._4_4_;
    auVar77._8_4_ = fVar215 * auVar287._8_4_ + fVar217 * auVar82._8_4_ + fVar219 * auVar155._8_4_;
    auVar77._12_4_ =
         fVar234 * auVar287._12_4_ + fVar236 * auVar82._12_4_ + fVar239 * auVar155._12_4_;
    auVar8 = vmovlhps_avx(_local_6f0,auVar313);
    auVar9 = vmovlhps_avx(_local_5b0,auVar267);
    auVar10 = vmovlhps_avx(auVar332,auVar108);
    auVar11 = vmovlhps_avx(auVar321,auVar77);
    auVar82 = vminps_avx(auVar8,auVar9);
    auVar287 = vminps_avx(auVar10,auVar11);
    auVar155 = vminps_avx(auVar82,auVar287);
    auVar82 = vmaxps_avx(auVar8,auVar9);
    auVar287 = vmaxps_avx(auVar10,auVar11);
    auVar82 = vmaxps_avx(auVar82,auVar287);
    auVar287 = vshufpd_avx(auVar155,auVar155,3);
    auVar155 = vminps_avx(auVar155,auVar287);
    auVar287 = vshufpd_avx(auVar82,auVar82,3);
    auVar287 = vmaxps_avx(auVar82,auVar287);
    auVar227._8_4_ = 0x7fffffff;
    auVar227._0_8_ = 0x7fffffff7fffffff;
    auVar227._12_4_ = 0x7fffffff;
    auVar82 = vandps_avx(auVar155,auVar227);
    auVar287 = vandps_avx(auVar287,auVar227);
    auVar82 = vmaxps_avx(auVar82,auVar287);
    auVar287 = vmovshdup_avx(auVar82);
    auVar82 = vmaxss_avx(auVar287,auVar82);
    fVar197 = auVar82._0_4_ * 9.536743e-07;
    local_370 = ZEXT416((uint)fVar197);
    auVar82 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
    local_340._16_16_ = auVar82;
    local_340._0_16_ = auVar82;
    auVar78._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
    auVar78._8_4_ = auVar82._8_4_ ^ 0x80000000;
    auVar78._12_4_ = auVar82._12_4_ ^ 0x80000000;
    local_360._16_16_ = auVar78;
    local_360._0_16_ = auVar78;
    auVar82 = vpshufd_avx(ZEXT416(uVar67),0);
    local_2e0._16_16_ = auVar82;
    local_2e0._0_16_ = auVar82;
    auVar82 = vpshufd_avx(ZEXT416(uVar13),0);
    local_300._16_16_ = auVar82;
    local_300._0_16_ = auVar82;
    uVar74 = 0;
    fVar197 = *(float *)(ray + k * 4 + 0x60);
    _local_380 = vsubps_avx(auVar9,auVar8);
    _local_390 = vsubps_avx(auVar10,auVar9);
    _local_3a0 = vsubps_avx(auVar11,auVar10);
    _local_450 = vsubps_avx(_local_4b0,_local_4a0);
    _local_460 = vsubps_avx(_local_500,_local_4e0);
    _local_470 = vsubps_avx(_local_440,_local_4f0);
    _local_480 = vsubps_avx(_local_4d0,_local_4c0);
    auVar296 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar304 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0100b9b5:
    auVar106 = auVar296._0_16_;
    auVar135 = auVar304._0_16_;
    local_430 = auVar135;
    auVar82 = vshufps_avx(auVar106,auVar106,0x50);
    auVar322._8_4_ = 0x3f800000;
    auVar322._0_8_ = 0x3f8000003f800000;
    auVar322._12_4_ = 0x3f800000;
    auVar327._16_4_ = 0x3f800000;
    auVar327._0_16_ = auVar322;
    auVar327._20_4_ = 0x3f800000;
    auVar327._24_4_ = 0x3f800000;
    auVar327._28_4_ = 0x3f800000;
    auVar287 = vsubps_avx(auVar322,auVar82);
    fVar221 = auVar82._0_4_;
    fVar215 = auVar82._4_4_;
    fVar234 = auVar82._8_4_;
    fVar216 = auVar82._12_4_;
    fVar235 = auVar287._0_4_;
    fVar217 = auVar287._4_4_;
    fVar236 = auVar287._8_4_;
    fVar218 = auVar287._12_4_;
    auVar165._0_4_ = auVar313._0_4_ * fVar221 + fVar235 * fVar220;
    auVar165._4_4_ = auVar313._4_4_ * fVar215 + fVar217 * fVar174;
    auVar165._8_4_ = auVar313._0_4_ * fVar234 + fVar236 * fVar220;
    auVar165._12_4_ = auVar313._4_4_ * fVar216 + fVar218 * fVar174;
    auVar138._0_4_ = auVar267._0_4_ * fVar221 + fVar235 * fVar240;
    auVar138._4_4_ = auVar267._4_4_ * fVar215 + fVar217 * fVar191;
    auVar138._8_4_ = auVar267._0_4_ * fVar234 + fVar236 * fVar240;
    auVar138._12_4_ = auVar267._4_4_ * fVar216 + fVar218 * fVar191;
    auVar246._0_4_ = auVar108._0_4_ * fVar221 + auVar332._0_4_ * fVar235;
    auVar246._4_4_ = auVar108._4_4_ * fVar215 + auVar332._4_4_ * fVar217;
    auVar246._8_4_ = auVar108._0_4_ * fVar234 + auVar332._0_4_ * fVar236;
    auVar246._12_4_ = auVar108._4_4_ * fVar216 + auVar332._4_4_ * fVar218;
    auVar177._0_4_ = auVar77._0_4_ * fVar221 + auVar321._0_4_ * fVar235;
    auVar177._4_4_ = auVar77._4_4_ * fVar215 + auVar321._4_4_ * fVar217;
    auVar177._8_4_ = auVar77._0_4_ * fVar234 + auVar321._0_4_ * fVar236;
    auVar177._12_4_ = auVar77._4_4_ * fVar216 + auVar321._4_4_ * fVar218;
    auVar82 = vmovshdup_avx(auVar135);
    auVar287 = vshufps_avx(auVar135,auVar135,0);
    auVar272._16_16_ = auVar287;
    auVar272._0_16_ = auVar287;
    auVar155 = vshufps_avx(auVar135,auVar135,0x55);
    auVar97._16_16_ = auVar155;
    auVar97._0_16_ = auVar155;
    auVar93 = vsubps_avx(auVar97,auVar272);
    auVar155 = vshufps_avx(auVar165,auVar165,0);
    auVar123 = vshufps_avx(auVar165,auVar165,0x55);
    auVar111 = vshufps_avx(auVar138,auVar138,0);
    auVar141 = vshufps_avx(auVar138,auVar138,0x55);
    auVar112 = vshufps_avx(auVar246,auVar246,0);
    auVar238 = vshufps_avx(auVar246,auVar246,0x55);
    auVar76 = vshufps_avx(auVar177,auVar177,0);
    auVar105 = vshufps_avx(auVar177,auVar177,0x55);
    auVar82 = ZEXT416((uint)((auVar82._0_4_ - auVar304._0_4_) * 0.04761905));
    auVar82 = vshufps_avx(auVar82,auVar82,0);
    auVar284._0_4_ = auVar287._0_4_ + auVar93._0_4_ * 0.0;
    auVar284._4_4_ = auVar287._4_4_ + auVar93._4_4_ * 0.14285715;
    auVar284._8_4_ = auVar287._8_4_ + auVar93._8_4_ * 0.2857143;
    auVar284._12_4_ = auVar287._12_4_ + auVar93._12_4_ * 0.42857146;
    auVar284._16_4_ = auVar287._0_4_ + auVar93._16_4_ * 0.5714286;
    auVar284._20_4_ = auVar287._4_4_ + auVar93._20_4_ * 0.71428573;
    auVar284._24_4_ = auVar287._8_4_ + auVar93._24_4_ * 0.8571429;
    auVar284._28_4_ = auVar287._12_4_ + auVar93._28_4_;
    auVar21 = vsubps_avx(auVar327,auVar284);
    fVar221 = auVar111._0_4_;
    fVar234 = auVar111._4_4_;
    fVar235 = auVar111._8_4_;
    fVar236 = auVar111._12_4_;
    fVar328 = auVar21._0_4_;
    fVar329 = auVar21._4_4_;
    fVar330 = auVar21._8_4_;
    fVar274 = auVar21._12_4_;
    fVar275 = auVar21._16_4_;
    fVar276 = auVar21._20_4_;
    fVar277 = auVar21._24_4_;
    fVar305 = auVar141._0_4_;
    fVar307 = auVar141._4_4_;
    fVar316 = auVar141._8_4_;
    fVar318 = auVar141._12_4_;
    fVar319 = auVar123._12_4_ + 1.0;
    fVar297 = auVar112._0_4_;
    fVar298 = auVar112._4_4_;
    fVar299 = auVar112._8_4_;
    fVar300 = auVar112._12_4_;
    fVar237 = fVar297 * auVar284._0_4_ + fVar328 * fVar221;
    fVar219 = fVar298 * auVar284._4_4_ + fVar329 * fVar234;
    fVar239 = fVar299 * auVar284._8_4_ + fVar330 * fVar235;
    fVar192 = fVar300 * auVar284._12_4_ + fVar274 * fVar236;
    fVar193 = fVar297 * auVar284._16_4_ + fVar275 * fVar221;
    fVar194 = fVar298 * auVar284._20_4_ + fVar276 * fVar234;
    fVar195 = fVar299 * auVar284._24_4_ + fVar277 * fVar235;
    fVar215 = auVar238._0_4_;
    fVar216 = auVar238._4_4_;
    fVar217 = auVar238._8_4_;
    fVar218 = auVar238._12_4_;
    fVar306 = fVar305 * fVar328 + auVar284._0_4_ * fVar215;
    fVar312 = fVar307 * fVar329 + auVar284._4_4_ * fVar216;
    fVar317 = fVar316 * fVar330 + auVar284._8_4_ * fVar217;
    fVar320 = fVar318 * fVar274 + auVar284._12_4_ * fVar218;
    fVar308 = fVar305 * fVar275 + auVar284._16_4_ * fVar215;
    fVar309 = fVar307 * fVar276 + auVar284._20_4_ * fVar216;
    fVar310 = fVar316 * fVar277 + auVar284._24_4_ * fVar217;
    fVar311 = fVar318 + fVar236;
    auVar287 = vshufps_avx(auVar165,auVar165,0xaa);
    auVar111 = vshufps_avx(auVar165,auVar165,0xff);
    fVar196 = fVar300 + 0.0;
    auVar141 = vshufps_avx(auVar138,auVar138,0xaa);
    auVar112 = vshufps_avx(auVar138,auVar138,0xff);
    auVar189._0_4_ =
         fVar328 * (auVar284._0_4_ * fVar221 + fVar328 * auVar155._0_4_) + auVar284._0_4_ * fVar237;
    auVar189._4_4_ =
         fVar329 * (auVar284._4_4_ * fVar234 + fVar329 * auVar155._4_4_) + auVar284._4_4_ * fVar219;
    auVar189._8_4_ =
         fVar330 * (auVar284._8_4_ * fVar235 + fVar330 * auVar155._8_4_) + auVar284._8_4_ * fVar239;
    auVar189._12_4_ =
         fVar274 * (auVar284._12_4_ * fVar236 + fVar274 * auVar155._12_4_) +
         auVar284._12_4_ * fVar192;
    auVar189._16_4_ =
         fVar275 * (auVar284._16_4_ * fVar221 + fVar275 * auVar155._0_4_) +
         auVar284._16_4_ * fVar193;
    auVar189._20_4_ =
         fVar276 * (auVar284._20_4_ * fVar234 + fVar276 * auVar155._4_4_) +
         auVar284._20_4_ * fVar194;
    auVar189._24_4_ =
         fVar277 * (auVar284._24_4_ * fVar235 + fVar277 * auVar155._8_4_) +
         auVar284._24_4_ * fVar195;
    auVar189._28_4_ = auVar155._12_4_ + 1.0 + fVar218;
    auVar213._0_4_ =
         fVar328 * (fVar305 * auVar284._0_4_ + auVar123._0_4_ * fVar328) + auVar284._0_4_ * fVar306;
    auVar213._4_4_ =
         fVar329 * (fVar307 * auVar284._4_4_ + auVar123._4_4_ * fVar329) + auVar284._4_4_ * fVar312;
    auVar213._8_4_ =
         fVar330 * (fVar316 * auVar284._8_4_ + auVar123._8_4_ * fVar330) + auVar284._8_4_ * fVar317;
    auVar213._12_4_ =
         fVar274 * (fVar318 * auVar284._12_4_ + auVar123._12_4_ * fVar274) +
         auVar284._12_4_ * fVar320;
    auVar213._16_4_ =
         fVar275 * (fVar305 * auVar284._16_4_ + auVar123._0_4_ * fVar275) +
         auVar284._16_4_ * fVar308;
    auVar213._20_4_ =
         fVar276 * (fVar307 * auVar284._20_4_ + auVar123._4_4_ * fVar276) +
         auVar284._20_4_ * fVar309;
    auVar213._24_4_ =
         fVar277 * (fVar316 * auVar284._24_4_ + auVar123._8_4_ * fVar277) +
         auVar284._24_4_ * fVar310;
    auVar213._28_4_ = auVar105._12_4_ + fVar218;
    auVar98._0_4_ =
         fVar328 * fVar237 + auVar284._0_4_ * (fVar297 * fVar328 + auVar76._0_4_ * auVar284._0_4_);
    auVar98._4_4_ =
         fVar329 * fVar219 + auVar284._4_4_ * (fVar298 * fVar329 + auVar76._4_4_ * auVar284._4_4_);
    auVar98._8_4_ =
         fVar330 * fVar239 + auVar284._8_4_ * (fVar299 * fVar330 + auVar76._8_4_ * auVar284._8_4_);
    auVar98._12_4_ =
         fVar274 * fVar192 +
         auVar284._12_4_ * (fVar300 * fVar274 + auVar76._12_4_ * auVar284._12_4_);
    auVar98._16_4_ =
         fVar275 * fVar193 + auVar284._16_4_ * (fVar297 * fVar275 + auVar76._0_4_ * auVar284._16_4_)
    ;
    auVar98._20_4_ =
         fVar276 * fVar194 + auVar284._20_4_ * (fVar298 * fVar276 + auVar76._4_4_ * auVar284._20_4_)
    ;
    auVar98._24_4_ =
         fVar277 * fVar195 + auVar284._24_4_ * (fVar299 * fVar277 + auVar76._8_4_ * auVar284._24_4_)
    ;
    auVar98._28_4_ = fVar236 + 1.0 + fVar196;
    auVar295._0_4_ =
         fVar328 * fVar306 + auVar284._0_4_ * (auVar105._0_4_ * auVar284._0_4_ + fVar328 * fVar215);
    auVar295._4_4_ =
         fVar329 * fVar312 + auVar284._4_4_ * (auVar105._4_4_ * auVar284._4_4_ + fVar329 * fVar216);
    auVar295._8_4_ =
         fVar330 * fVar317 + auVar284._8_4_ * (auVar105._8_4_ * auVar284._8_4_ + fVar330 * fVar217);
    auVar295._12_4_ =
         fVar274 * fVar320 +
         auVar284._12_4_ * (auVar105._12_4_ * auVar284._12_4_ + fVar274 * fVar218);
    auVar295._16_4_ =
         fVar275 * fVar308 +
         auVar284._16_4_ * (auVar105._0_4_ * auVar284._16_4_ + fVar275 * fVar215);
    auVar295._20_4_ =
         fVar276 * fVar309 +
         auVar284._20_4_ * (auVar105._4_4_ * auVar284._20_4_ + fVar276 * fVar216);
    auVar295._24_4_ =
         fVar277 * fVar310 +
         auVar284._24_4_ * (auVar105._8_4_ * auVar284._24_4_ + fVar277 * fVar217);
    auVar295._28_4_ = fVar196 + fVar218 + 0.0;
    local_1e0._0_4_ = fVar328 * auVar189._0_4_ + auVar284._0_4_ * auVar98._0_4_;
    local_1e0._4_4_ = fVar329 * auVar189._4_4_ + auVar284._4_4_ * auVar98._4_4_;
    local_1e0._8_4_ = fVar330 * auVar189._8_4_ + auVar284._8_4_ * auVar98._8_4_;
    local_1e0._12_4_ = fVar274 * auVar189._12_4_ + auVar284._12_4_ * auVar98._12_4_;
    local_1e0._16_4_ = fVar275 * auVar189._16_4_ + auVar284._16_4_ * auVar98._16_4_;
    local_1e0._20_4_ = fVar276 * auVar189._20_4_ + auVar284._20_4_ * auVar98._20_4_;
    local_1e0._24_4_ = fVar277 * auVar189._24_4_ + auVar284._24_4_ * auVar98._24_4_;
    local_1e0._28_4_ = fVar311 + fVar218 + 0.0;
    auVar173._0_4_ = fVar328 * auVar213._0_4_ + auVar284._0_4_ * auVar295._0_4_;
    auVar173._4_4_ = fVar329 * auVar213._4_4_ + auVar284._4_4_ * auVar295._4_4_;
    auVar173._8_4_ = fVar330 * auVar213._8_4_ + auVar284._8_4_ * auVar295._8_4_;
    auVar173._12_4_ = fVar274 * auVar213._12_4_ + auVar284._12_4_ * auVar295._12_4_;
    auVar173._16_4_ = fVar275 * auVar213._16_4_ + auVar284._16_4_ * auVar295._16_4_;
    auVar173._20_4_ = fVar276 * auVar213._20_4_ + auVar284._20_4_ * auVar295._20_4_;
    auVar173._24_4_ = fVar277 * auVar213._24_4_ + auVar284._24_4_ * auVar295._24_4_;
    auVar173._28_4_ = fVar311 + fVar196;
    auVar22 = vsubps_avx(auVar98,auVar189);
    auVar93 = vsubps_avx(auVar295,auVar213);
    local_620 = auVar82._0_4_;
    fStack_61c = auVar82._4_4_;
    fStack_618 = auVar82._8_4_;
    fStack_614 = auVar82._12_4_;
    local_220 = local_620 * auVar22._0_4_ * 3.0;
    fStack_21c = fStack_61c * auVar22._4_4_ * 3.0;
    auVar29._4_4_ = fStack_21c;
    auVar29._0_4_ = local_220;
    fStack_218 = fStack_618 * auVar22._8_4_ * 3.0;
    auVar29._8_4_ = fStack_218;
    fStack_214 = fStack_614 * auVar22._12_4_ * 3.0;
    auVar29._12_4_ = fStack_214;
    fStack_210 = local_620 * auVar22._16_4_ * 3.0;
    auVar29._16_4_ = fStack_210;
    fStack_20c = fStack_61c * auVar22._20_4_ * 3.0;
    auVar29._20_4_ = fStack_20c;
    fStack_208 = fStack_618 * auVar22._24_4_ * 3.0;
    auVar29._24_4_ = fStack_208;
    auVar29._28_4_ = auVar22._28_4_;
    local_240 = local_620 * auVar93._0_4_ * 3.0;
    fStack_23c = fStack_61c * auVar93._4_4_ * 3.0;
    auVar30._4_4_ = fStack_23c;
    auVar30._0_4_ = local_240;
    fStack_238 = fStack_618 * auVar93._8_4_ * 3.0;
    auVar30._8_4_ = fStack_238;
    fStack_234 = fStack_614 * auVar93._12_4_ * 3.0;
    auVar30._12_4_ = fStack_234;
    fStack_230 = local_620 * auVar93._16_4_ * 3.0;
    auVar30._16_4_ = fStack_230;
    fStack_22c = fStack_61c * auVar93._20_4_ * 3.0;
    auVar30._20_4_ = fStack_22c;
    fStack_228 = fStack_618 * auVar93._24_4_ * 3.0;
    auVar30._24_4_ = fStack_228;
    auVar30._28_4_ = fVar311;
    auVar19 = vsubps_avx(local_1e0,auVar29);
    auVar93 = vperm2f128_avx(auVar19,auVar19,1);
    auVar93 = vshufps_avx(auVar93,auVar19,0x30);
    auVar93 = vshufps_avx(auVar19,auVar93,0x29);
    auVar20 = vsubps_avx(auVar173,auVar30);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar309 = auVar141._0_4_;
    fVar310 = auVar141._4_4_;
    fVar335 = auVar141._8_4_;
    fVar236 = auVar287._12_4_;
    fVar298 = auVar112._0_4_;
    fVar300 = auVar112._4_4_;
    fVar306 = auVar112._8_4_;
    fVar312 = auVar112._12_4_;
    auVar82 = vshufps_avx(auVar246,auVar246,0xaa);
    fVar221 = auVar82._0_4_;
    fVar234 = auVar82._4_4_;
    fVar235 = auVar82._8_4_;
    fVar218 = auVar82._12_4_;
    fVar239 = auVar284._0_4_ * fVar221 + fVar309 * fVar328;
    fVar192 = auVar284._4_4_ * fVar234 + fVar310 * fVar329;
    fVar193 = auVar284._8_4_ * fVar235 + fVar335 * fVar330;
    fVar194 = auVar284._12_4_ * fVar218 + auVar141._12_4_ * fVar274;
    fVar195 = auVar284._16_4_ * fVar221 + fVar309 * fVar275;
    fVar196 = auVar284._20_4_ * fVar234 + fVar310 * fVar276;
    fVar297 = auVar284._24_4_ * fVar235 + fVar335 * fVar277;
    auVar82 = vshufps_avx(auVar246,auVar246,0xff);
    fVar215 = auVar82._0_4_;
    fVar216 = auVar82._4_4_;
    fVar217 = auVar82._8_4_;
    fVar237 = auVar82._12_4_;
    fVar299 = auVar284._0_4_ * fVar215 + fVar298 * fVar328;
    fVar305 = auVar284._4_4_ * fVar216 + fVar300 * fVar329;
    fVar307 = auVar284._8_4_ * fVar217 + fVar306 * fVar330;
    fVar316 = auVar284._12_4_ * fVar237 + fVar312 * fVar274;
    fVar317 = auVar284._16_4_ * fVar215 + fVar298 * fVar275;
    fVar318 = auVar284._20_4_ * fVar216 + fVar300 * fVar276;
    fVar320 = auVar284._24_4_ * fVar217 + fVar306 * fVar277;
    auVar82 = vshufps_avx(auVar177,auVar177,0xaa);
    fVar308 = auVar82._12_4_ + fVar218;
    auVar155 = vshufps_avx(auVar177,auVar177,0xff);
    fVar219 = auVar155._12_4_;
    auVar99._0_4_ =
         fVar328 * (fVar309 * auVar284._0_4_ + fVar328 * auVar287._0_4_) + auVar284._0_4_ * fVar239;
    auVar99._4_4_ =
         fVar329 * (fVar310 * auVar284._4_4_ + fVar329 * auVar287._4_4_) + auVar284._4_4_ * fVar192;
    auVar99._8_4_ =
         fVar330 * (fVar335 * auVar284._8_4_ + fVar330 * auVar287._8_4_) + auVar284._8_4_ * fVar193;
    auVar99._12_4_ =
         fVar274 * (auVar141._12_4_ * auVar284._12_4_ + fVar274 * fVar236) +
         auVar284._12_4_ * fVar194;
    auVar99._16_4_ =
         fVar275 * (fVar309 * auVar284._16_4_ + fVar275 * auVar287._0_4_) +
         auVar284._16_4_ * fVar195;
    auVar99._20_4_ =
         fVar276 * (fVar310 * auVar284._20_4_ + fVar276 * auVar287._4_4_) +
         auVar284._20_4_ * fVar196;
    auVar99._24_4_ =
         fVar277 * (fVar335 * auVar284._24_4_ + fVar277 * auVar287._8_4_) +
         auVar284._24_4_ * fVar297;
    auVar99._28_4_ = auVar20._28_4_ + fVar236 + fVar219;
    auVar131._0_4_ =
         fVar328 * (fVar298 * auVar284._0_4_ + auVar111._0_4_ * fVar328) + auVar284._0_4_ * fVar299;
    auVar131._4_4_ =
         fVar329 * (fVar300 * auVar284._4_4_ + auVar111._4_4_ * fVar329) + auVar284._4_4_ * fVar305;
    auVar131._8_4_ =
         fVar330 * (fVar306 * auVar284._8_4_ + auVar111._8_4_ * fVar330) + auVar284._8_4_ * fVar307;
    auVar131._12_4_ =
         fVar274 * (fVar312 * auVar284._12_4_ + auVar111._12_4_ * fVar274) +
         auVar284._12_4_ * fVar316;
    auVar131._16_4_ =
         fVar275 * (fVar298 * auVar284._16_4_ + auVar111._0_4_ * fVar275) +
         auVar284._16_4_ * fVar317;
    auVar131._20_4_ =
         fVar276 * (fVar300 * auVar284._20_4_ + auVar111._4_4_ * fVar276) +
         auVar284._20_4_ * fVar318;
    auVar131._24_4_ =
         fVar277 * (fVar306 * auVar284._24_4_ + auVar111._8_4_ * fVar277) +
         auVar284._24_4_ * fVar320;
    auVar131._28_4_ = fVar236 + auVar19._28_4_ + fVar219;
    auVar19 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar19 = vshufps_avx(auVar19,local_1e0,0x30);
    _local_520 = vshufps_avx(local_1e0,auVar19,0x29);
    auVar214._0_4_ =
         auVar284._0_4_ * (auVar82._0_4_ * auVar284._0_4_ + fVar328 * fVar221) + fVar328 * fVar239;
    auVar214._4_4_ =
         auVar284._4_4_ * (auVar82._4_4_ * auVar284._4_4_ + fVar329 * fVar234) + fVar329 * fVar192;
    auVar214._8_4_ =
         auVar284._8_4_ * (auVar82._8_4_ * auVar284._8_4_ + fVar330 * fVar235) + fVar330 * fVar193;
    auVar214._12_4_ =
         auVar284._12_4_ * (auVar82._12_4_ * auVar284._12_4_ + fVar274 * fVar218) +
         fVar274 * fVar194;
    auVar214._16_4_ =
         auVar284._16_4_ * (auVar82._0_4_ * auVar284._16_4_ + fVar275 * fVar221) + fVar275 * fVar195
    ;
    auVar214._20_4_ =
         auVar284._20_4_ * (auVar82._4_4_ * auVar284._20_4_ + fVar276 * fVar234) + fVar276 * fVar196
    ;
    auVar214._24_4_ =
         auVar284._24_4_ * (auVar82._8_4_ * auVar284._24_4_ + fVar277 * fVar235) + fVar277 * fVar297
    ;
    auVar214._28_4_ = fVar308 + fVar319 + auVar213._28_4_;
    auVar261._0_4_ =
         fVar328 * fVar299 + auVar284._0_4_ * (auVar284._0_4_ * auVar155._0_4_ + fVar328 * fVar215);
    auVar261._4_4_ =
         fVar329 * fVar305 + auVar284._4_4_ * (auVar284._4_4_ * auVar155._4_4_ + fVar329 * fVar216);
    auVar261._8_4_ =
         fVar330 * fVar307 + auVar284._8_4_ * (auVar284._8_4_ * auVar155._8_4_ + fVar330 * fVar217);
    auVar261._12_4_ =
         fVar274 * fVar316 + auVar284._12_4_ * (auVar284._12_4_ * fVar219 + fVar274 * fVar237);
    auVar261._16_4_ =
         fVar275 * fVar317 +
         auVar284._16_4_ * (auVar284._16_4_ * auVar155._0_4_ + fVar275 * fVar215);
    auVar261._20_4_ =
         fVar276 * fVar318 +
         auVar284._20_4_ * (auVar284._20_4_ * auVar155._4_4_ + fVar276 * fVar216);
    auVar261._24_4_ =
         fVar277 * fVar320 +
         auVar284._24_4_ * (auVar284._24_4_ * auVar155._8_4_ + fVar277 * fVar217);
    auVar261._28_4_ = fVar319 + fVar312 + fVar219 + fVar237;
    auVar255._0_4_ = fVar328 * auVar99._0_4_ + auVar284._0_4_ * auVar214._0_4_;
    auVar255._4_4_ = fVar329 * auVar99._4_4_ + auVar284._4_4_ * auVar214._4_4_;
    auVar255._8_4_ = fVar330 * auVar99._8_4_ + auVar284._8_4_ * auVar214._8_4_;
    auVar255._12_4_ = fVar274 * auVar99._12_4_ + auVar284._12_4_ * auVar214._12_4_;
    auVar255._16_4_ = fVar275 * auVar99._16_4_ + auVar284._16_4_ * auVar214._16_4_;
    auVar255._20_4_ = fVar276 * auVar99._20_4_ + auVar284._20_4_ * auVar214._20_4_;
    auVar255._24_4_ = fVar277 * auVar99._24_4_ + auVar284._24_4_ * auVar214._24_4_;
    auVar255._28_4_ = fVar308 + fVar219 + fVar237;
    auVar273._0_4_ = fVar328 * auVar131._0_4_ + auVar284._0_4_ * auVar261._0_4_;
    auVar273._4_4_ = fVar329 * auVar131._4_4_ + auVar284._4_4_ * auVar261._4_4_;
    auVar273._8_4_ = fVar330 * auVar131._8_4_ + auVar284._8_4_ * auVar261._8_4_;
    auVar273._12_4_ = fVar274 * auVar131._12_4_ + auVar284._12_4_ * auVar261._12_4_;
    auVar273._16_4_ = fVar275 * auVar131._16_4_ + auVar284._16_4_ * auVar261._16_4_;
    auVar273._20_4_ = fVar276 * auVar131._20_4_ + auVar284._20_4_ * auVar261._20_4_;
    auVar273._24_4_ = fVar277 * auVar131._24_4_ + auVar284._24_4_ * auVar261._24_4_;
    auVar273._28_4_ = auVar21._28_4_ + auVar284._28_4_;
    auVar25 = vsubps_avx(auVar214,auVar99);
    auVar19 = vsubps_avx(auVar261,auVar131);
    local_260 = local_620 * auVar25._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar25._4_4_ * 3.0;
    auVar31._4_4_ = fStack_25c;
    auVar31._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar25._8_4_ * 3.0;
    auVar31._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar25._12_4_ * 3.0;
    auVar31._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar25._16_4_ * 3.0;
    auVar31._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar25._20_4_ * 3.0;
    auVar31._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar25._24_4_ * 3.0;
    auVar31._24_4_ = fStack_248;
    auVar31._28_4_ = auVar25._28_4_;
    local_280 = local_620 * auVar19._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar19._4_4_ * 3.0;
    auVar32._4_4_ = fStack_27c;
    auVar32._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar19._8_4_ * 3.0;
    auVar32._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar19._12_4_ * 3.0;
    auVar32._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar19._16_4_ * 3.0;
    auVar32._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar19._20_4_ * 3.0;
    auVar32._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar19._24_4_ * 3.0;
    auVar32._24_4_ = fStack_268;
    auVar32._28_4_ = auVar214._28_4_;
    auVar19 = vperm2f128_avx(auVar255,auVar255,1);
    auVar19 = vshufps_avx(auVar19,auVar255,0x30);
    auVar23 = vshufps_avx(auVar255,auVar19,0x29);
    auVar21 = vsubps_avx(auVar255,auVar31);
    auVar19 = vperm2f128_avx(auVar21,auVar21,1);
    auVar19 = vshufps_avx(auVar19,auVar21,0x30);
    auVar19 = vshufps_avx(auVar21,auVar19,0x29);
    auVar24 = vsubps_avx(auVar273,auVar32);
    auVar21 = vperm2f128_avx(auVar24,auVar24,1);
    auVar21 = vshufps_avx(auVar21,auVar24,0x30);
    auVar24 = vshufps_avx(auVar24,auVar21,0x29);
    auVar26 = vsubps_avx(auVar255,local_1e0);
    auVar27 = vsubps_avx(auVar23,_local_520);
    fVar221 = auVar27._0_4_ + auVar26._0_4_;
    fVar215 = auVar27._4_4_ + auVar26._4_4_;
    fVar234 = auVar27._8_4_ + auVar26._8_4_;
    fVar216 = auVar27._12_4_ + auVar26._12_4_;
    fVar235 = auVar27._16_4_ + auVar26._16_4_;
    fVar217 = auVar27._20_4_ + auVar26._20_4_;
    fVar236 = auVar27._24_4_ + auVar26._24_4_;
    auVar21 = vperm2f128_avx(auVar173,auVar173,1);
    auVar21 = vshufps_avx(auVar21,auVar173,0x30);
    local_200 = vshufps_avx(auVar173,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar273,auVar273,1);
    auVar21 = vshufps_avx(auVar21,auVar273,0x30);
    local_1c0 = vshufps_avx(auVar273,auVar21,0x29);
    auVar21 = vsubps_avx(auVar273,auVar173);
    auVar28 = vsubps_avx(local_1c0,local_200);
    fVar218 = auVar28._0_4_ + auVar21._0_4_;
    fVar237 = auVar28._4_4_ + auVar21._4_4_;
    fVar219 = auVar28._8_4_ + auVar21._8_4_;
    fVar239 = auVar28._12_4_ + auVar21._12_4_;
    fVar192 = auVar28._16_4_ + auVar21._16_4_;
    fVar193 = auVar28._20_4_ + auVar21._20_4_;
    fVar194 = auVar28._24_4_ + auVar21._24_4_;
    auVar33._4_4_ = fVar215 * auVar173._4_4_;
    auVar33._0_4_ = fVar221 * auVar173._0_4_;
    auVar33._8_4_ = fVar234 * auVar173._8_4_;
    auVar33._12_4_ = fVar216 * auVar173._12_4_;
    auVar33._16_4_ = fVar235 * auVar173._16_4_;
    auVar33._20_4_ = fVar217 * auVar173._20_4_;
    auVar33._24_4_ = fVar236 * auVar173._24_4_;
    auVar33._28_4_ = auVar21._28_4_;
    auVar34._4_4_ = fVar237 * local_1e0._4_4_;
    auVar34._0_4_ = fVar218 * local_1e0._0_4_;
    auVar34._8_4_ = fVar219 * local_1e0._8_4_;
    auVar34._12_4_ = fVar239 * local_1e0._12_4_;
    auVar34._16_4_ = fVar192 * local_1e0._16_4_;
    auVar34._20_4_ = fVar193 * local_1e0._20_4_;
    auVar34._24_4_ = fVar194 * local_1e0._24_4_;
    auVar34._28_4_ = fVar308;
    auVar94 = vsubps_avx(auVar33,auVar34);
    local_220 = local_1e0._0_4_ + local_220;
    fStack_21c = local_1e0._4_4_ + fStack_21c;
    fStack_218 = local_1e0._8_4_ + fStack_218;
    fStack_214 = local_1e0._12_4_ + fStack_214;
    fStack_210 = local_1e0._16_4_ + fStack_210;
    fStack_20c = local_1e0._20_4_ + fStack_20c;
    fStack_208 = local_1e0._24_4_ + fStack_208;
    fStack_204 = local_1e0._28_4_ + auVar22._28_4_;
    local_240 = local_240 + auVar173._0_4_;
    fStack_23c = fStack_23c + auVar173._4_4_;
    fStack_238 = fStack_238 + auVar173._8_4_;
    fStack_234 = fStack_234 + auVar173._12_4_;
    fStack_230 = fStack_230 + auVar173._16_4_;
    fStack_22c = fStack_22c + auVar173._20_4_;
    fStack_228 = fStack_228 + auVar173._24_4_;
    fStack_224 = fVar311 + auVar173._28_4_;
    auVar35._4_4_ = fVar215 * fStack_23c;
    auVar35._0_4_ = fVar221 * local_240;
    auVar35._8_4_ = fVar234 * fStack_238;
    auVar35._12_4_ = fVar216 * fStack_234;
    auVar35._16_4_ = fVar235 * fStack_230;
    auVar35._20_4_ = fVar217 * fStack_22c;
    auVar35._24_4_ = fVar236 * fStack_228;
    auVar35._28_4_ = fVar311;
    auVar36._4_4_ = fVar237 * fStack_21c;
    auVar36._0_4_ = fVar218 * local_220;
    auVar36._8_4_ = fVar219 * fStack_218;
    auVar36._12_4_ = fVar239 * fStack_214;
    auVar36._16_4_ = fVar192 * fStack_210;
    auVar36._20_4_ = fVar193 * fStack_20c;
    auVar36._24_4_ = fVar194 * fStack_208;
    auVar36._28_4_ = fVar311 + auVar173._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar36);
    local_660 = auVar20._0_4_;
    fStack_65c = auVar20._4_4_;
    fStack_658 = auVar20._8_4_;
    fStack_654 = auVar20._12_4_;
    fStack_650 = auVar20._16_4_;
    fStack_64c = auVar20._20_4_;
    fStack_648 = auVar20._24_4_;
    auVar37._4_4_ = fVar215 * fStack_65c;
    auVar37._0_4_ = fVar221 * local_660;
    auVar37._8_4_ = fVar234 * fStack_658;
    auVar37._12_4_ = fVar216 * fStack_654;
    auVar37._16_4_ = fVar235 * fStack_650;
    auVar37._20_4_ = fVar217 * fStack_64c;
    auVar37._24_4_ = fVar236 * fStack_648;
    auVar37._28_4_ = fVar311;
    local_6a0 = auVar93._0_4_;
    fStack_69c = auVar93._4_4_;
    fStack_698 = auVar93._8_4_;
    fStack_694 = auVar93._12_4_;
    fStack_690 = auVar93._16_4_;
    fStack_68c = auVar93._20_4_;
    fStack_688 = auVar93._24_4_;
    auVar38._4_4_ = fVar237 * fStack_69c;
    auVar38._0_4_ = fVar218 * local_6a0;
    auVar38._8_4_ = fVar219 * fStack_698;
    auVar38._12_4_ = fVar239 * fStack_694;
    auVar38._16_4_ = fVar192 * fStack_690;
    auVar38._20_4_ = fVar193 * fStack_68c;
    auVar38._24_4_ = fVar194 * fStack_688;
    auVar38._28_4_ = local_1e0._28_4_;
    auVar95 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = local_200._4_4_ * fVar215;
    auVar39._0_4_ = local_200._0_4_ * fVar221;
    auVar39._8_4_ = local_200._8_4_ * fVar234;
    auVar39._12_4_ = local_200._12_4_ * fVar216;
    auVar39._16_4_ = local_200._16_4_ * fVar235;
    auVar39._20_4_ = local_200._20_4_ * fVar217;
    auVar39._24_4_ = local_200._24_4_ * fVar236;
    auVar39._28_4_ = fVar311;
    auVar40._4_4_ = local_520._4_4_ * fVar237;
    auVar40._0_4_ = local_520._0_4_ * fVar218;
    auVar40._8_4_ = local_520._8_4_ * fVar219;
    auVar40._12_4_ = local_520._12_4_ * fVar239;
    auVar40._16_4_ = local_520._16_4_ * fVar192;
    auVar40._20_4_ = local_520._20_4_ * fVar193;
    auVar40._24_4_ = local_520._24_4_ * fVar194;
    auVar40._28_4_ = local_200._28_4_;
    local_620 = auVar19._0_4_;
    fStack_61c = auVar19._4_4_;
    fStack_618 = auVar19._8_4_;
    fStack_614 = auVar19._12_4_;
    fStack_610 = auVar19._16_4_;
    fStack_60c = auVar19._20_4_;
    fStack_608 = auVar19._24_4_;
    auVar127 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar273._4_4_ * fVar215;
    auVar41._0_4_ = auVar273._0_4_ * fVar221;
    auVar41._8_4_ = auVar273._8_4_ * fVar234;
    auVar41._12_4_ = auVar273._12_4_ * fVar216;
    auVar41._16_4_ = auVar273._16_4_ * fVar235;
    auVar41._20_4_ = auVar273._20_4_ * fVar217;
    auVar41._24_4_ = auVar273._24_4_ * fVar236;
    auVar41._28_4_ = fVar311;
    auVar42._4_4_ = fVar237 * auVar255._4_4_;
    auVar42._0_4_ = fVar218 * auVar255._0_4_;
    auVar42._8_4_ = fVar219 * auVar255._8_4_;
    auVar42._12_4_ = fVar239 * auVar255._12_4_;
    auVar42._16_4_ = fVar192 * auVar255._16_4_;
    auVar42._20_4_ = fVar193 * auVar255._20_4_;
    auVar42._24_4_ = fVar194 * auVar255._24_4_;
    auVar42._28_4_ = fStack_204;
    auVar128 = vsubps_avx(auVar41,auVar42);
    local_260 = auVar255._0_4_ + local_260;
    fStack_25c = auVar255._4_4_ + fStack_25c;
    fStack_258 = auVar255._8_4_ + fStack_258;
    fStack_254 = auVar255._12_4_ + fStack_254;
    fStack_250 = auVar255._16_4_ + fStack_250;
    fStack_24c = auVar255._20_4_ + fStack_24c;
    fStack_248 = auVar255._24_4_ + fStack_248;
    fStack_244 = auVar255._28_4_ + auVar25._28_4_;
    local_280 = auVar273._0_4_ + local_280;
    fStack_27c = auVar273._4_4_ + fStack_27c;
    fStack_278 = auVar273._8_4_ + fStack_278;
    fStack_274 = auVar273._12_4_ + fStack_274;
    fStack_270 = auVar273._16_4_ + fStack_270;
    fStack_26c = auVar273._20_4_ + fStack_26c;
    fStack_268 = auVar273._24_4_ + fStack_268;
    fStack_264 = auVar273._28_4_ + auVar214._28_4_;
    auVar43._4_4_ = fVar215 * fStack_27c;
    auVar43._0_4_ = fVar221 * local_280;
    auVar43._8_4_ = fVar234 * fStack_278;
    auVar43._12_4_ = fVar216 * fStack_274;
    auVar43._16_4_ = fVar235 * fStack_270;
    auVar43._20_4_ = fVar217 * fStack_26c;
    auVar43._24_4_ = fVar236 * fStack_268;
    auVar43._28_4_ = auVar273._28_4_ + auVar214._28_4_;
    auVar44._4_4_ = fStack_25c * fVar237;
    auVar44._0_4_ = local_260 * fVar218;
    auVar44._8_4_ = fStack_258 * fVar219;
    auVar44._12_4_ = fStack_254 * fVar239;
    auVar44._16_4_ = fStack_250 * fVar192;
    auVar44._20_4_ = fStack_24c * fVar193;
    auVar44._24_4_ = fStack_248 * fVar194;
    auVar44._28_4_ = fStack_244;
    auVar25 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar215 * auVar24._4_4_;
    auVar45._0_4_ = fVar221 * auVar24._0_4_;
    auVar45._8_4_ = fVar234 * auVar24._8_4_;
    auVar45._12_4_ = fVar216 * auVar24._12_4_;
    auVar45._16_4_ = fVar235 * auVar24._16_4_;
    auVar45._20_4_ = fVar217 * auVar24._20_4_;
    auVar45._24_4_ = fVar236 * auVar24._24_4_;
    auVar45._28_4_ = fStack_244;
    auVar46._4_4_ = fVar237 * fStack_61c;
    auVar46._0_4_ = fVar218 * local_620;
    auVar46._8_4_ = fVar219 * fStack_618;
    auVar46._12_4_ = fVar239 * fStack_614;
    auVar46._16_4_ = fVar192 * fStack_610;
    auVar46._20_4_ = fVar193 * fStack_60c;
    auVar46._24_4_ = fVar194 * fStack_608;
    auVar46._28_4_ = auVar24._28_4_;
    auVar129 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar215 * local_1c0._4_4_;
    auVar47._0_4_ = fVar221 * local_1c0._0_4_;
    auVar47._8_4_ = fVar234 * local_1c0._8_4_;
    auVar47._12_4_ = fVar216 * local_1c0._12_4_;
    auVar47._16_4_ = fVar235 * local_1c0._16_4_;
    auVar47._20_4_ = fVar217 * local_1c0._20_4_;
    auVar47._24_4_ = fVar236 * local_1c0._24_4_;
    auVar47._28_4_ = auVar27._28_4_ + auVar26._28_4_;
    auVar48._4_4_ = auVar23._4_4_ * fVar237;
    auVar48._0_4_ = auVar23._0_4_ * fVar218;
    auVar48._8_4_ = auVar23._8_4_ * fVar219;
    auVar48._12_4_ = auVar23._12_4_ * fVar239;
    auVar48._16_4_ = auVar23._16_4_ * fVar192;
    auVar48._20_4_ = auVar23._20_4_ * fVar193;
    auVar48._24_4_ = auVar23._24_4_ * fVar194;
    auVar48._28_4_ = auVar28._28_4_ + auVar21._28_4_;
    auVar26 = vsubps_avx(auVar47,auVar48);
    auVar19 = vminps_avx(auVar94,auVar22);
    auVar93 = vmaxps_avx(auVar94,auVar22);
    auVar20 = vminps_avx(auVar95,auVar127);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar95,auVar127);
    auVar93 = vmaxps_avx(auVar93,auVar19);
    auVar21 = vminps_avx(auVar128,auVar25);
    auVar19 = vmaxps_avx(auVar128,auVar25);
    auVar22 = vminps_avx(auVar129,auVar26);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar20,auVar22);
    auVar20 = vmaxps_avx(auVar129,auVar26);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar93,auVar19);
    auVar93 = vcmpps_avx(auVar22,local_340,2);
    auVar19 = vcmpps_avx(auVar19,local_360,5);
    auVar93 = vandps_avx(auVar19,auVar93);
    auVar19 = local_2a0 & auVar93;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(_local_520,local_1e0);
      auVar20 = vsubps_avx(auVar23,auVar255);
      fVar215 = auVar19._0_4_ + auVar20._0_4_;
      fVar234 = auVar19._4_4_ + auVar20._4_4_;
      fVar216 = auVar19._8_4_ + auVar20._8_4_;
      fVar235 = auVar19._12_4_ + auVar20._12_4_;
      fVar217 = auVar19._16_4_ + auVar20._16_4_;
      fVar236 = auVar19._20_4_ + auVar20._20_4_;
      fVar218 = auVar19._24_4_ + auVar20._24_4_;
      auVar22 = vsubps_avx(local_200,auVar173);
      auVar25 = vsubps_avx(local_1c0,auVar273);
      fVar237 = auVar22._0_4_ + auVar25._0_4_;
      fVar219 = auVar22._4_4_ + auVar25._4_4_;
      fVar239 = auVar22._8_4_ + auVar25._8_4_;
      fVar192 = auVar22._12_4_ + auVar25._12_4_;
      fVar193 = auVar22._16_4_ + auVar25._16_4_;
      fVar194 = auVar22._20_4_ + auVar25._20_4_;
      fVar195 = auVar22._24_4_ + auVar25._24_4_;
      fVar221 = auVar25._28_4_;
      auVar49._4_4_ = auVar173._4_4_ * fVar234;
      auVar49._0_4_ = auVar173._0_4_ * fVar215;
      auVar49._8_4_ = auVar173._8_4_ * fVar216;
      auVar49._12_4_ = auVar173._12_4_ * fVar235;
      auVar49._16_4_ = auVar173._16_4_ * fVar217;
      auVar49._20_4_ = auVar173._20_4_ * fVar236;
      auVar49._24_4_ = auVar173._24_4_ * fVar218;
      auVar49._28_4_ = auVar173._28_4_;
      auVar50._4_4_ = local_1e0._4_4_ * fVar219;
      auVar50._0_4_ = local_1e0._0_4_ * fVar237;
      auVar50._8_4_ = local_1e0._8_4_ * fVar239;
      auVar50._12_4_ = local_1e0._12_4_ * fVar192;
      auVar50._16_4_ = local_1e0._16_4_ * fVar193;
      auVar50._20_4_ = local_1e0._20_4_ * fVar194;
      auVar50._24_4_ = local_1e0._24_4_ * fVar195;
      auVar50._28_4_ = local_1e0._28_4_;
      auVar25 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar234 * fStack_23c;
      auVar51._0_4_ = fVar215 * local_240;
      auVar51._8_4_ = fVar216 * fStack_238;
      auVar51._12_4_ = fVar235 * fStack_234;
      auVar51._16_4_ = fVar217 * fStack_230;
      auVar51._20_4_ = fVar236 * fStack_22c;
      auVar51._24_4_ = fVar218 * fStack_228;
      auVar51._28_4_ = auVar173._28_4_;
      auVar52._4_4_ = fVar219 * fStack_21c;
      auVar52._0_4_ = fVar237 * local_220;
      auVar52._8_4_ = fVar239 * fStack_218;
      auVar52._12_4_ = fVar192 * fStack_214;
      auVar52._16_4_ = fVar193 * fStack_210;
      auVar52._20_4_ = fVar194 * fStack_20c;
      auVar52._24_4_ = fVar195 * fStack_208;
      auVar52._28_4_ = fVar221;
      auVar26 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar234 * fStack_65c;
      auVar53._0_4_ = fVar215 * local_660;
      auVar53._8_4_ = fVar216 * fStack_658;
      auVar53._12_4_ = fVar235 * fStack_654;
      auVar53._16_4_ = fVar217 * fStack_650;
      auVar53._20_4_ = fVar236 * fStack_64c;
      auVar53._24_4_ = fVar218 * fStack_648;
      auVar53._28_4_ = fVar221;
      auVar54._4_4_ = fVar219 * fStack_69c;
      auVar54._0_4_ = fVar237 * local_6a0;
      auVar54._8_4_ = fVar239 * fStack_698;
      auVar54._12_4_ = fVar192 * fStack_694;
      auVar54._16_4_ = fVar193 * fStack_690;
      auVar54._20_4_ = fVar194 * fStack_68c;
      auVar54._24_4_ = fVar195 * fStack_688;
      auVar54._28_4_ = auVar21._28_4_;
      auVar27 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_200._4_4_ * fVar234;
      auVar55._0_4_ = local_200._0_4_ * fVar215;
      auVar55._8_4_ = local_200._8_4_ * fVar216;
      auVar55._12_4_ = local_200._12_4_ * fVar235;
      auVar55._16_4_ = local_200._16_4_ * fVar217;
      auVar55._20_4_ = local_200._20_4_ * fVar236;
      auVar55._24_4_ = local_200._24_4_ * fVar218;
      auVar55._28_4_ = auVar21._28_4_;
      auVar56._4_4_ = local_520._4_4_ * fVar219;
      auVar56._0_4_ = local_520._0_4_ * fVar237;
      auVar56._8_4_ = local_520._8_4_ * fVar239;
      auVar56._12_4_ = local_520._12_4_ * fVar192;
      auVar56._16_4_ = local_520._16_4_ * fVar193;
      auVar56._20_4_ = local_520._20_4_ * fVar194;
      uVar6 = local_520._28_4_;
      auVar56._24_4_ = local_520._24_4_ * fVar195;
      auVar56._28_4_ = uVar6;
      auVar28 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = auVar273._4_4_ * fVar234;
      auVar57._0_4_ = auVar273._0_4_ * fVar215;
      auVar57._8_4_ = auVar273._8_4_ * fVar216;
      auVar57._12_4_ = auVar273._12_4_ * fVar235;
      auVar57._16_4_ = auVar273._16_4_ * fVar217;
      auVar57._20_4_ = auVar273._20_4_ * fVar236;
      auVar57._24_4_ = auVar273._24_4_ * fVar218;
      auVar57._28_4_ = uVar6;
      auVar58._4_4_ = auVar255._4_4_ * fVar219;
      auVar58._0_4_ = auVar255._0_4_ * fVar237;
      auVar58._8_4_ = auVar255._8_4_ * fVar239;
      auVar58._12_4_ = auVar255._12_4_ * fVar192;
      auVar58._16_4_ = auVar255._16_4_ * fVar193;
      auVar58._20_4_ = auVar255._20_4_ * fVar194;
      auVar58._24_4_ = auVar255._24_4_ * fVar195;
      auVar58._28_4_ = auVar255._28_4_;
      auVar94 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar234 * fStack_27c;
      auVar59._0_4_ = fVar215 * local_280;
      auVar59._8_4_ = fVar216 * fStack_278;
      auVar59._12_4_ = fVar235 * fStack_274;
      auVar59._16_4_ = fVar217 * fStack_270;
      auVar59._20_4_ = fVar236 * fStack_26c;
      auVar59._24_4_ = fVar218 * fStack_268;
      auVar59._28_4_ = uVar6;
      auVar60._4_4_ = fVar219 * fStack_25c;
      auVar60._0_4_ = fVar237 * local_260;
      auVar60._8_4_ = fVar239 * fStack_258;
      auVar60._12_4_ = fVar192 * fStack_254;
      auVar60._16_4_ = fVar193 * fStack_250;
      auVar60._20_4_ = fVar194 * fStack_24c;
      auVar60._24_4_ = fVar195 * fStack_248;
      auVar60._28_4_ = auVar273._28_4_;
      auVar95 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar234 * auVar24._4_4_;
      auVar61._0_4_ = fVar215 * auVar24._0_4_;
      auVar61._8_4_ = fVar216 * auVar24._8_4_;
      auVar61._12_4_ = fVar235 * auVar24._12_4_;
      auVar61._16_4_ = fVar217 * auVar24._16_4_;
      auVar61._20_4_ = fVar236 * auVar24._20_4_;
      auVar61._24_4_ = fVar218 * auVar24._24_4_;
      auVar61._28_4_ = auVar273._28_4_;
      auVar62._4_4_ = fStack_61c * fVar219;
      auVar62._0_4_ = local_620 * fVar237;
      auVar62._8_4_ = fStack_618 * fVar239;
      auVar62._12_4_ = fStack_614 * fVar192;
      auVar62._16_4_ = fStack_610 * fVar193;
      auVar62._20_4_ = fStack_60c * fVar194;
      auVar62._24_4_ = fStack_608 * fVar195;
      auVar62._28_4_ = local_200._28_4_;
      auVar24 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_1c0._4_4_ * fVar234;
      auVar63._0_4_ = local_1c0._0_4_ * fVar215;
      auVar63._8_4_ = local_1c0._8_4_ * fVar216;
      auVar63._12_4_ = local_1c0._12_4_ * fVar235;
      auVar63._16_4_ = local_1c0._16_4_ * fVar217;
      auVar63._20_4_ = local_1c0._20_4_ * fVar236;
      auVar63._24_4_ = local_1c0._24_4_ * fVar218;
      auVar63._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar64._4_4_ = auVar23._4_4_ * fVar219;
      auVar64._0_4_ = auVar23._0_4_ * fVar237;
      auVar64._8_4_ = auVar23._8_4_ * fVar239;
      auVar64._12_4_ = auVar23._12_4_ * fVar192;
      auVar64._16_4_ = auVar23._16_4_ * fVar193;
      auVar64._20_4_ = auVar23._20_4_ * fVar194;
      auVar64._24_4_ = auVar23._24_4_ * fVar195;
      auVar64._28_4_ = auVar22._28_4_ + fVar221;
      auVar127 = vsubps_avx(auVar63,auVar64);
      auVar20 = vminps_avx(auVar25,auVar26);
      auVar19 = vmaxps_avx(auVar25,auVar26);
      auVar21 = vminps_avx(auVar27,auVar28);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar27,auVar28);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(auVar94,auVar95);
      auVar20 = vmaxps_avx(auVar94,auVar95);
      auVar23 = vminps_avx(auVar24,auVar127);
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar24,auVar127);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,local_340,2);
      auVar20 = vcmpps_avx(auVar20,local_360,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar93 = vandps_avx(local_2a0,auVar93);
      auVar20 = auVar93 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar19,auVar93);
        uVar71 = vmovmskps_avx(auVar93);
        if (uVar71 != 0) {
          uVar68 = (ulong)uVar74;
          auStack_490[uVar68] = uVar71 & 0xff;
          uVar7 = vmovlps_avx(auVar135);
          *(undefined8 *)(afStack_320 + uVar68 * 2) = uVar7;
          uVar72 = vmovlps_avx(auVar106);
          auStack_1a0[uVar68] = uVar72;
          uVar74 = uVar74 + 1;
        }
      }
    }
    if (uVar74 != 0) {
      do {
        uVar68 = (ulong)(uVar74 - 1);
        uVar71 = auStack_490[uVar68];
        fVar221 = afStack_320[uVar68 * 2];
        fVar215 = afStack_320[uVar68 * 2 + 1];
        auVar288._8_8_ = 0;
        auVar288._0_8_ = auStack_1a0[uVar68];
        auVar296 = ZEXT1664(auVar288);
        uVar72 = 0;
        if (uVar71 != 0) {
          for (; (uVar71 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
          }
        }
        uVar71 = uVar71 - 1 & uVar71;
        auStack_490[uVar68] = uVar71;
        if (uVar71 == 0) {
          uVar74 = uVar74 - 1;
        }
        fVar216 = (float)(uVar72 + 1) * 0.14285715;
        fVar234 = (1.0 - (float)uVar72 * 0.14285715) * fVar221 +
                  fVar215 * (float)uVar72 * 0.14285715;
        fVar221 = (1.0 - fVar216) * fVar221 + fVar215 * fVar216;
        fVar215 = fVar221 - fVar234;
        if (0.16666667 <= fVar215) {
          auVar82 = vinsertps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar221),0x10);
          auVar304 = ZEXT1664(auVar82);
          goto LAB_0100b9b5;
        }
        auVar82 = vshufps_avx(auVar288,auVar288,0x50);
        auVar109._8_4_ = 0x3f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._12_4_ = 0x3f800000;
        auVar287 = vsubps_avx(auVar109,auVar82);
        fVar216 = auVar82._0_4_;
        fVar235 = auVar82._4_4_;
        fVar217 = auVar82._8_4_;
        fVar236 = auVar82._12_4_;
        fVar218 = auVar287._0_4_;
        fVar237 = auVar287._4_4_;
        fVar219 = auVar287._8_4_;
        fVar239 = auVar287._12_4_;
        auVar139._0_4_ = fVar216 * auVar313._0_4_ + fVar218 * fVar220;
        auVar139._4_4_ = fVar235 * auVar313._4_4_ + fVar237 * fVar174;
        auVar139._8_4_ = fVar217 * auVar313._0_4_ + fVar219 * fVar220;
        auVar139._12_4_ = fVar236 * auVar313._4_4_ + fVar239 * fVar174;
        auVar178._0_4_ = fVar216 * auVar267._0_4_ + fVar218 * fVar240;
        auVar178._4_4_ = fVar235 * auVar267._4_4_ + fVar237 * fVar191;
        auVar178._8_4_ = fVar217 * auVar267._0_4_ + fVar219 * fVar240;
        auVar178._12_4_ = fVar236 * auVar267._4_4_ + fVar239 * fVar191;
        auVar205._0_4_ = fVar216 * auVar108._0_4_ + auVar332._0_4_ * fVar218;
        auVar205._4_4_ = fVar235 * auVar108._4_4_ + auVar332._4_4_ * fVar237;
        auVar205._8_4_ = fVar217 * auVar108._0_4_ + auVar332._0_4_ * fVar219;
        auVar205._12_4_ = fVar236 * auVar108._4_4_ + auVar332._4_4_ * fVar239;
        auVar79._0_4_ = auVar77._0_4_ * fVar216 + auVar321._0_4_ * fVar218;
        auVar79._4_4_ = auVar77._4_4_ * fVar235 + auVar321._4_4_ * fVar237;
        auVar79._8_4_ = auVar77._0_4_ * fVar217 + auVar321._0_4_ * fVar219;
        auVar79._12_4_ = auVar77._4_4_ * fVar236 + auVar321._4_4_ * fVar239;
        auVar132._16_16_ = auVar139;
        auVar132._0_16_ = auVar139;
        auVar159._16_16_ = auVar178;
        auVar159._0_16_ = auVar178;
        auVar190._16_16_ = auVar205;
        auVar190._0_16_ = auVar205;
        auVar93 = ZEXT2032(CONCAT416(fVar221,ZEXT416((uint)fVar234)));
        auVar93 = vshufps_avx(auVar93,auVar93,0);
        auVar19 = vsubps_avx(auVar159,auVar132);
        fVar216 = auVar93._0_4_;
        fVar235 = auVar93._4_4_;
        fVar217 = auVar93._8_4_;
        fVar236 = auVar93._12_4_;
        fVar218 = auVar93._16_4_;
        fVar237 = auVar93._20_4_;
        fVar219 = auVar93._24_4_;
        auVar133._0_4_ = auVar139._0_4_ + auVar19._0_4_ * fVar216;
        auVar133._4_4_ = auVar139._4_4_ + auVar19._4_4_ * fVar235;
        auVar133._8_4_ = auVar139._8_4_ + auVar19._8_4_ * fVar217;
        auVar133._12_4_ = auVar139._12_4_ + auVar19._12_4_ * fVar236;
        auVar133._16_4_ = auVar139._0_4_ + auVar19._16_4_ * fVar218;
        auVar133._20_4_ = auVar139._4_4_ + auVar19._20_4_ * fVar237;
        auVar133._24_4_ = auVar139._8_4_ + auVar19._24_4_ * fVar219;
        auVar133._28_4_ = auVar139._12_4_ + auVar19._28_4_;
        auVar93 = vsubps_avx(auVar190,auVar159);
        auVar160._0_4_ = auVar178._0_4_ + auVar93._0_4_ * fVar216;
        auVar160._4_4_ = auVar178._4_4_ + auVar93._4_4_ * fVar235;
        auVar160._8_4_ = auVar178._8_4_ + auVar93._8_4_ * fVar217;
        auVar160._12_4_ = auVar178._12_4_ + auVar93._12_4_ * fVar236;
        auVar160._16_4_ = auVar178._0_4_ + auVar93._16_4_ * fVar218;
        auVar160._20_4_ = auVar178._4_4_ + auVar93._20_4_ * fVar237;
        auVar160._24_4_ = auVar178._8_4_ + auVar93._24_4_ * fVar219;
        auVar160._28_4_ = auVar178._12_4_ + auVar93._28_4_;
        auVar82 = vsubps_avx(auVar79,auVar205);
        auVar100._0_4_ = auVar205._0_4_ + auVar82._0_4_ * fVar216;
        auVar100._4_4_ = auVar205._4_4_ + auVar82._4_4_ * fVar235;
        auVar100._8_4_ = auVar205._8_4_ + auVar82._8_4_ * fVar217;
        auVar100._12_4_ = auVar205._12_4_ + auVar82._12_4_ * fVar236;
        auVar100._16_4_ = auVar205._0_4_ + auVar82._0_4_ * fVar218;
        auVar100._20_4_ = auVar205._4_4_ + auVar82._4_4_ * fVar237;
        auVar100._24_4_ = auVar205._8_4_ + auVar82._8_4_ * fVar219;
        auVar100._28_4_ = auVar205._12_4_ + auVar82._12_4_;
        auVar93 = vsubps_avx(auVar160,auVar133);
        auVar134._0_4_ = auVar133._0_4_ + fVar216 * auVar93._0_4_;
        auVar134._4_4_ = auVar133._4_4_ + fVar235 * auVar93._4_4_;
        auVar134._8_4_ = auVar133._8_4_ + fVar217 * auVar93._8_4_;
        auVar134._12_4_ = auVar133._12_4_ + fVar236 * auVar93._12_4_;
        auVar134._16_4_ = auVar133._16_4_ + fVar218 * auVar93._16_4_;
        auVar134._20_4_ = auVar133._20_4_ + fVar237 * auVar93._20_4_;
        auVar134._24_4_ = auVar133._24_4_ + fVar219 * auVar93._24_4_;
        auVar134._28_4_ = auVar133._28_4_ + auVar93._28_4_;
        auVar93 = vsubps_avx(auVar100,auVar160);
        auVar101._0_4_ = auVar160._0_4_ + fVar216 * auVar93._0_4_;
        auVar101._4_4_ = auVar160._4_4_ + fVar235 * auVar93._4_4_;
        auVar101._8_4_ = auVar160._8_4_ + fVar217 * auVar93._8_4_;
        auVar101._12_4_ = auVar160._12_4_ + fVar236 * auVar93._12_4_;
        auVar101._16_4_ = auVar160._16_4_ + fVar218 * auVar93._16_4_;
        auVar101._20_4_ = auVar160._20_4_ + fVar237 * auVar93._20_4_;
        auVar101._24_4_ = auVar160._24_4_ + fVar219 * auVar93._24_4_;
        auVar101._28_4_ = auVar160._28_4_ + auVar93._28_4_;
        auVar93 = vsubps_avx(auVar101,auVar134);
        auVar228._0_4_ = auVar134._0_4_ + fVar216 * auVar93._0_4_;
        auVar228._4_4_ = auVar134._4_4_ + fVar235 * auVar93._4_4_;
        auVar228._8_4_ = auVar134._8_4_ + fVar217 * auVar93._8_4_;
        auVar228._12_4_ = auVar134._12_4_ + fVar236 * auVar93._12_4_;
        auVar233._16_4_ = auVar134._16_4_ + fVar218 * auVar93._16_4_;
        auVar233._0_16_ = auVar228;
        auVar233._20_4_ = auVar134._20_4_ + fVar237 * auVar93._20_4_;
        auVar233._24_4_ = auVar134._24_4_ + fVar219 * auVar93._24_4_;
        auVar233._28_4_ = auVar134._28_4_ + auVar160._28_4_;
        auVar238 = auVar233._16_16_;
        auVar111 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.33333334)),
                               ZEXT416((uint)(fVar215 * 0.33333334)),0);
        auVar179._0_4_ = auVar228._0_4_ + auVar111._0_4_ * auVar93._0_4_ * 3.0;
        auVar179._4_4_ = auVar228._4_4_ + auVar111._4_4_ * auVar93._4_4_ * 3.0;
        auVar179._8_4_ = auVar228._8_4_ + auVar111._8_4_ * auVar93._8_4_ * 3.0;
        auVar179._12_4_ = auVar228._12_4_ + auVar111._12_4_ * auVar93._12_4_ * 3.0;
        auVar155 = vshufpd_avx(auVar228,auVar228,3);
        auVar123 = vshufpd_avx(auVar238,auVar238,3);
        _local_520 = auVar155;
        auVar82 = vsubps_avx(auVar155,auVar228);
        auVar287 = vsubps_avx(auVar123,auVar238);
        auVar80._0_4_ = auVar82._0_4_ + auVar287._0_4_;
        auVar80._4_4_ = auVar82._4_4_ + auVar287._4_4_;
        auVar80._8_4_ = auVar82._8_4_ + auVar287._8_4_;
        auVar80._12_4_ = auVar82._12_4_ + auVar287._12_4_;
        auVar82 = vmovshdup_avx(auVar228);
        auVar287 = vmovshdup_avx(auVar179);
        auVar141 = vshufps_avx(auVar80,auVar80,0);
        auVar112 = vshufps_avx(auVar80,auVar80,0x55);
        fVar216 = auVar112._0_4_;
        fVar235 = auVar112._4_4_;
        fVar217 = auVar112._8_4_;
        fVar236 = auVar112._12_4_;
        fVar218 = auVar141._0_4_;
        fVar237 = auVar141._4_4_;
        fVar219 = auVar141._8_4_;
        fVar239 = auVar141._12_4_;
        auVar81._0_4_ = fVar218 * auVar228._0_4_ + auVar82._0_4_ * fVar216;
        auVar81._4_4_ = fVar237 * auVar228._4_4_ + auVar82._4_4_ * fVar235;
        auVar81._8_4_ = fVar219 * auVar228._8_4_ + auVar82._8_4_ * fVar217;
        auVar81._12_4_ = fVar239 * auVar228._12_4_ + auVar82._12_4_ * fVar236;
        auVar289._0_4_ = fVar218 * auVar179._0_4_ + auVar287._0_4_ * fVar216;
        auVar289._4_4_ = fVar237 * auVar179._4_4_ + auVar287._4_4_ * fVar235;
        auVar289._8_4_ = fVar219 * auVar179._8_4_ + auVar287._8_4_ * fVar217;
        auVar289._12_4_ = fVar239 * auVar179._12_4_ + auVar287._12_4_ * fVar236;
        auVar287 = vshufps_avx(auVar81,auVar81,0xe8);
        auVar141 = vshufps_avx(auVar289,auVar289,0xe8);
        auVar82 = vcmpps_avx(auVar287,auVar141,1);
        uVar71 = vextractps_avx(auVar82,0);
        auVar112 = auVar289;
        if ((uVar71 & 1) == 0) {
          auVar112 = auVar81;
        }
        auVar110._0_4_ = auVar111._0_4_ * auVar93._16_4_ * 3.0;
        auVar110._4_4_ = auVar111._4_4_ * auVar93._20_4_ * 3.0;
        auVar110._8_4_ = auVar111._8_4_ * auVar93._24_4_ * 3.0;
        auVar110._12_4_ = auVar111._12_4_ * 0.0;
        auVar105 = vsubps_avx(auVar238,auVar110);
        auVar111 = vmovshdup_avx(auVar105);
        auVar238 = vmovshdup_avx(auVar238);
        fVar192 = auVar105._0_4_;
        fVar193 = auVar105._4_4_;
        auVar206._0_4_ = fVar192 * fVar218 + auVar111._0_4_ * fVar216;
        auVar206._4_4_ = fVar193 * fVar237 + auVar111._4_4_ * fVar235;
        auVar206._8_4_ = auVar105._8_4_ * fVar219 + auVar111._8_4_ * fVar217;
        auVar206._12_4_ = auVar105._12_4_ * fVar239 + auVar111._12_4_ * fVar236;
        auVar333._0_4_ = fVar218 * auVar233._16_4_ + auVar238._0_4_ * fVar216;
        auVar333._4_4_ = fVar237 * auVar233._20_4_ + auVar238._4_4_ * fVar235;
        auVar333._8_4_ = fVar219 * auVar233._24_4_ + auVar238._8_4_ * fVar217;
        auVar333._12_4_ = fVar239 * auVar233._28_4_ + auVar238._12_4_ * fVar236;
        auVar238 = vshufps_avx(auVar206,auVar206,0xe8);
        auVar76 = vshufps_avx(auVar333,auVar333,0xe8);
        auVar111 = vcmpps_avx(auVar238,auVar76,1);
        uVar71 = vextractps_avx(auVar111,0);
        auVar106 = auVar333;
        if ((uVar71 & 1) == 0) {
          auVar106 = auVar206;
        }
        auVar112 = vmaxss_avx(auVar106,auVar112);
        auVar287 = vminps_avx(auVar287,auVar141);
        auVar141 = vminps_avx(auVar238,auVar76);
        auVar141 = vminps_avx(auVar287,auVar141);
        auVar82 = vshufps_avx(auVar82,auVar82,0x55);
        auVar82 = vblendps_avx(auVar82,auVar111,2);
        auVar111 = vpslld_avx(auVar82,0x1f);
        auVar82 = vshufpd_avx(auVar289,auVar289,1);
        auVar82 = vinsertps_avx(auVar82,auVar333,0x9c);
        auVar287 = vshufpd_avx(auVar81,auVar81,1);
        auVar287 = vinsertps_avx(auVar287,auVar206,0x9c);
        auVar82 = vblendvps_avx(auVar287,auVar82,auVar111);
        auVar287 = vmovshdup_avx(auVar82);
        auVar82 = vmaxss_avx(auVar287,auVar82);
        fVar217 = auVar141._0_4_;
        auVar287 = vmovshdup_avx(auVar141);
        fVar235 = auVar82._0_4_;
        fVar236 = auVar287._0_4_;
        fVar216 = auVar112._0_4_;
        if ((0.0001 <= fVar217) || (fVar235 <= -0.0001)) {
          if ((fVar236 < 0.0001 && -0.0001 < fVar216) || (fVar217 < 0.0001 && -0.0001 < fVar216))
          goto LAB_0100c3be;
          auVar111 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar82,1);
          auVar287 = vcmpps_avx(auVar287,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar287 = vandps_avx(auVar287,auVar111);
          if ((auVar287 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_0100c3be;
        }
        else {
LAB_0100c3be:
          auVar111 = vcmpps_avx(auVar141,_DAT_01f7aa10,1);
          auVar287 = vcmpss_avx(auVar112,ZEXT416(0) << 0x20,1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar180._8_4_ = 0xbf800000;
          auVar180._0_8_ = 0xbf800000bf800000;
          auVar180._12_4_ = 0xbf800000;
          auVar287 = vblendvps_avx(auVar140,auVar180,auVar287);
          auVar111 = vblendvps_avx(auVar140,auVar180,auVar111);
          auVar141 = vcmpss_avx(auVar111,auVar287,4);
          auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
          auVar141 = vpslld_avx(auVar141,0x1f);
          auVar141 = vpsrad_avx(auVar141,0x1f);
          auVar141 = vpandn_avx(auVar141,_DAT_01fafeb0);
          auVar112 = vmovshdup_avx(auVar111);
          fVar218 = auVar112._0_4_;
          if ((auVar111._0_4_ != fVar218) || (NAN(auVar111._0_4_) || NAN(fVar218))) {
            if ((fVar236 != fVar217) || (NAN(fVar236) || NAN(fVar217))) {
              fVar217 = -fVar217 / (fVar236 - fVar217);
              auVar111 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar217) * 0.0 + fVar217)));
            }
            else {
              auVar111 = ZEXT816(0x3f80000000000000);
              if ((fVar217 != 0.0) || (NAN(fVar217))) {
                auVar111 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar238 = vcmpps_avx(auVar141,auVar111,1);
            auVar112 = vblendps_avx(auVar141,auVar111,2);
            auVar111 = vblendps_avx(auVar111,auVar141,2);
            auVar141 = vblendvps_avx(auVar111,auVar112,auVar238);
          }
          auVar82 = vcmpss_avx(auVar82,ZEXT416(0) << 0x20,1);
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = 0x3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar181._8_4_ = 0xbf800000;
          auVar181._0_8_ = 0xbf800000bf800000;
          auVar181._12_4_ = 0xbf800000;
          auVar82 = vblendvps_avx(auVar142,auVar181,auVar82);
          fVar217 = auVar82._0_4_;
          if ((auVar287._0_4_ != fVar217) || (NAN(auVar287._0_4_) || NAN(fVar217))) {
            if ((fVar235 != fVar216) || (NAN(fVar235) || NAN(fVar216))) {
              fVar216 = -fVar216 / (fVar235 - fVar216);
              auVar82 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar216) * 0.0 + fVar216)));
            }
            else {
              auVar82 = ZEXT816(0x3f80000000000000);
              if ((fVar216 != 0.0) || (NAN(fVar216))) {
                auVar82 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar111 = vcmpps_avx(auVar141,auVar82,1);
            auVar287 = vblendps_avx(auVar141,auVar82,2);
            auVar82 = vblendps_avx(auVar82,auVar141,2);
            auVar141 = vblendvps_avx(auVar82,auVar287,auVar111);
          }
          if ((fVar218 != fVar217) || (NAN(fVar218) || NAN(fVar217))) {
            auVar83._8_4_ = 0x3f800000;
            auVar83._0_8_ = 0x3f8000003f800000;
            auVar83._12_4_ = 0x3f800000;
            auVar82 = vcmpps_avx(auVar141,auVar83,1);
            auVar287 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar143._4_12_ = auVar141._4_12_;
            auVar143._0_4_ = 0x3f800000;
            auVar141 = vblendvps_avx(auVar143,auVar287,auVar82);
          }
          auVar82 = vcmpps_avx(auVar141,_DAT_01f7b6f0,1);
          auVar66._12_4_ = 0;
          auVar66._0_12_ = auVar141._4_12_;
          auVar287 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
          auVar82 = vblendvps_avx(auVar287,auVar66 << 0x20,auVar82);
          auVar287 = vmovshdup_avx(auVar82);
          if (auVar82._0_4_ <= auVar287._0_4_) {
            auVar84._0_4_ = auVar82._0_4_ + -0.1;
            auVar84._4_4_ = auVar82._4_4_ + 0.1;
            auVar84._8_4_ = auVar82._8_4_ + 0.0;
            auVar84._12_4_ = auVar82._12_4_ + 0.0;
            auVar111 = vshufpd_avx(auVar179,auVar179,3);
            auVar229._8_8_ = 0x3f80000000000000;
            auVar229._0_8_ = 0x3f80000000000000;
            auVar82 = vcmpps_avx(auVar84,auVar229,1);
            auVar65._12_4_ = 0;
            auVar65._0_12_ = auVar84._4_12_;
            auVar287 = vinsertps_avx(auVar84,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar82 = vblendvps_avx(auVar287,auVar65 << 0x20,auVar82);
            auVar287 = vshufpd_avx(auVar105,auVar105,3);
            auVar141 = vshufps_avx(auVar82,auVar82,0x50);
            auVar323._8_4_ = 0x3f800000;
            auVar323._0_8_ = 0x3f8000003f800000;
            auVar323._12_4_ = 0x3f800000;
            auVar112 = vsubps_avx(auVar323,auVar141);
            local_520._0_4_ = auVar155._0_4_;
            local_520._4_4_ = auVar155._4_4_;
            fStack_518 = auVar155._8_4_;
            fStack_514 = auVar155._12_4_;
            fVar216 = auVar141._0_4_;
            fVar235 = auVar141._4_4_;
            fVar217 = auVar141._8_4_;
            fVar236 = auVar141._12_4_;
            local_680 = auVar123._0_4_;
            fStack_67c = auVar123._4_4_;
            fStack_678 = auVar123._8_4_;
            fStack_674 = auVar123._12_4_;
            fVar218 = auVar112._0_4_;
            fVar237 = auVar112._4_4_;
            fVar219 = auVar112._8_4_;
            fVar239 = auVar112._12_4_;
            auVar85._0_4_ = fVar216 * (float)local_520._0_4_ + fVar218 * auVar228._0_4_;
            auVar85._4_4_ = fVar235 * (float)local_520._4_4_ + fVar237 * auVar228._4_4_;
            auVar85._8_4_ = fVar217 * fStack_518 + fVar219 * auVar228._0_4_;
            auVar85._12_4_ = fVar236 * fStack_514 + fVar239 * auVar228._4_4_;
            auVar207._0_4_ = auVar111._0_4_ * fVar216 + fVar218 * auVar179._0_4_;
            auVar207._4_4_ = auVar111._4_4_ * fVar235 + fVar237 * auVar179._4_4_;
            auVar207._8_4_ = auVar111._8_4_ * fVar217 + fVar219 * auVar179._0_4_;
            auVar207._12_4_ = auVar111._12_4_ * fVar236 + fVar239 * auVar179._4_4_;
            auVar247._0_4_ = auVar287._0_4_ * fVar216 + fVar218 * fVar192;
            auVar247._4_4_ = auVar287._4_4_ * fVar235 + fVar237 * fVar193;
            auVar247._8_4_ = auVar287._8_4_ * fVar217 + fVar219 * fVar192;
            auVar247._12_4_ = auVar287._12_4_ * fVar236 + fVar239 * fVar193;
            auVar279._0_4_ = fVar216 * local_680 + fVar218 * auVar233._16_4_;
            auVar279._4_4_ = fVar235 * fStack_67c + fVar237 * auVar233._20_4_;
            auVar279._8_4_ = fVar217 * fStack_678 + fVar219 * auVar233._16_4_;
            auVar279._12_4_ = fVar236 * fStack_674 + fVar239 * auVar233._20_4_;
            auVar123 = vsubps_avx(auVar323,auVar82);
            auVar287 = vmovshdup_avx(auVar288);
            auVar155 = vmovsldup_avx(auVar288);
            auVar334._0_4_ = auVar123._0_4_ * auVar155._0_4_ + auVar82._0_4_ * auVar287._0_4_;
            auVar334._4_4_ = auVar123._4_4_ * auVar155._4_4_ + auVar82._4_4_ * auVar287._4_4_;
            auVar334._8_4_ = auVar123._8_4_ * auVar155._8_4_ + auVar82._8_4_ * auVar287._8_4_;
            auVar334._12_4_ = auVar123._12_4_ * auVar155._12_4_ + auVar82._12_4_ * auVar287._12_4_;
            auVar105 = vmovshdup_avx(auVar334);
            auVar82 = vsubps_avx(auVar207,auVar85);
            auVar144._0_4_ = auVar82._0_4_ * 3.0;
            auVar144._4_4_ = auVar82._4_4_ * 3.0;
            auVar144._8_4_ = auVar82._8_4_ * 3.0;
            auVar144._12_4_ = auVar82._12_4_ * 3.0;
            auVar82 = vsubps_avx(auVar247,auVar207);
            auVar166._0_4_ = auVar82._0_4_ * 3.0;
            auVar166._4_4_ = auVar82._4_4_ * 3.0;
            auVar166._8_4_ = auVar82._8_4_ * 3.0;
            auVar166._12_4_ = auVar82._12_4_ * 3.0;
            auVar82 = vsubps_avx(auVar279,auVar247);
            auVar259._0_4_ = auVar82._0_4_ * 3.0;
            auVar259._4_4_ = auVar82._4_4_ * 3.0;
            auVar259._8_4_ = auVar82._8_4_ * 3.0;
            auVar259._12_4_ = auVar82._12_4_ * 3.0;
            auVar287 = vminps_avx(auVar166,auVar259);
            auVar82 = vmaxps_avx(auVar166,auVar259);
            auVar287 = vminps_avx(auVar144,auVar287);
            auVar82 = vmaxps_avx(auVar144,auVar82);
            auVar155 = vshufpd_avx(auVar287,auVar287,3);
            auVar123 = vshufpd_avx(auVar82,auVar82,3);
            auVar287 = vminps_avx(auVar287,auVar155);
            auVar82 = vmaxps_avx(auVar82,auVar123);
            auVar155 = vshufps_avx(ZEXT416((uint)(1.0 / fVar215)),ZEXT416((uint)(1.0 / fVar215)),0);
            auVar260._0_4_ = auVar155._0_4_ * auVar287._0_4_;
            auVar260._4_4_ = auVar155._4_4_ * auVar287._4_4_;
            auVar260._8_4_ = auVar155._8_4_ * auVar287._8_4_;
            auVar260._12_4_ = auVar155._12_4_ * auVar287._12_4_;
            auVar268._0_4_ = auVar155._0_4_ * auVar82._0_4_;
            auVar268._4_4_ = auVar155._4_4_ * auVar82._4_4_;
            auVar268._8_4_ = auVar155._8_4_ * auVar82._8_4_;
            auVar268._12_4_ = auVar155._12_4_ * auVar82._12_4_;
            auVar112 = ZEXT416((uint)(1.0 / (auVar105._0_4_ - auVar334._0_4_)));
            auVar82 = vshufpd_avx(auVar85,auVar85,3);
            auVar287 = vshufpd_avx(auVar207,auVar207,3);
            auVar155 = vshufpd_avx(auVar247,auVar247,3);
            auVar123 = vshufpd_avx(auVar279,auVar279,3);
            auVar82 = vsubps_avx(auVar82,auVar85);
            auVar111 = vsubps_avx(auVar287,auVar207);
            auVar141 = vsubps_avx(auVar155,auVar247);
            auVar123 = vsubps_avx(auVar123,auVar279);
            auVar287 = vminps_avx(auVar82,auVar111);
            auVar82 = vmaxps_avx(auVar82,auVar111);
            auVar155 = vminps_avx(auVar141,auVar123);
            auVar155 = vminps_avx(auVar287,auVar155);
            auVar287 = vmaxps_avx(auVar141,auVar123);
            auVar82 = vmaxps_avx(auVar82,auVar287);
            auVar287 = vshufps_avx(auVar112,auVar112,0);
            auVar314._0_4_ = auVar287._0_4_ * auVar155._0_4_;
            auVar314._4_4_ = auVar287._4_4_ * auVar155._4_4_;
            auVar314._8_4_ = auVar287._8_4_ * auVar155._8_4_;
            auVar314._12_4_ = auVar287._12_4_ * auVar155._12_4_;
            auVar324._0_4_ = auVar287._0_4_ * auVar82._0_4_;
            auVar324._4_4_ = auVar287._4_4_ * auVar82._4_4_;
            auVar324._8_4_ = auVar287._8_4_ * auVar82._8_4_;
            auVar324._12_4_ = auVar287._12_4_ * auVar82._12_4_;
            auVar82 = vmovsldup_avx(auVar334);
            auVar280._4_12_ = auVar82._4_12_;
            auVar280._0_4_ = fVar234;
            auVar290._4_12_ = auVar334._4_12_;
            auVar290._0_4_ = fVar221;
            auVar167._0_4_ = (fVar234 + fVar221) * 0.5;
            auVar167._4_4_ = (auVar82._4_4_ + auVar334._4_4_) * 0.5;
            auVar167._8_4_ = (auVar82._8_4_ + auVar334._8_4_) * 0.5;
            auVar167._12_4_ = (auVar82._12_4_ + auVar334._12_4_) * 0.5;
            auVar82 = vshufps_avx(auVar167,auVar167,0);
            fVar216 = auVar82._0_4_;
            fVar235 = auVar82._4_4_;
            fVar217 = auVar82._8_4_;
            fVar236 = auVar82._12_4_;
            local_630 = auVar8._0_4_;
            fStack_62c = auVar8._4_4_;
            fStack_628 = auVar8._8_4_;
            fStack_624 = auVar8._12_4_;
            auVar113._0_4_ = fVar216 * (float)local_380._0_4_ + local_630;
            auVar113._4_4_ = fVar235 * (float)local_380._4_4_ + fStack_62c;
            auVar113._8_4_ = fVar217 * fStack_378 + fStack_628;
            auVar113._12_4_ = fVar236 * fStack_374 + fStack_624;
            local_6f0._0_4_ = auVar9._0_4_;
            local_6f0._4_4_ = auVar9._4_4_;
            fStack_6e8 = auVar9._8_4_;
            fStack_6e4 = auVar9._12_4_;
            auVar145._0_4_ = fVar216 * (float)local_390._0_4_ + (float)local_6f0._0_4_;
            auVar145._4_4_ = fVar235 * (float)local_390._4_4_ + (float)local_6f0._4_4_;
            auVar145._8_4_ = fVar217 * fStack_388 + fStack_6e8;
            auVar145._12_4_ = fVar236 * fStack_384 + fStack_6e4;
            local_640 = auVar10._0_4_;
            fStack_63c = auVar10._4_4_;
            fStack_638 = auVar10._8_4_;
            fStack_634 = auVar10._12_4_;
            auVar208._0_4_ = fVar216 * (float)local_3a0._0_4_ + local_640;
            auVar208._4_4_ = fVar235 * (float)local_3a0._4_4_ + fStack_63c;
            auVar208._8_4_ = fVar217 * fStack_398 + fStack_638;
            auVar208._12_4_ = fVar236 * fStack_394 + fStack_634;
            auVar82 = vsubps_avx(auVar145,auVar113);
            auVar114._0_4_ = auVar113._0_4_ + fVar216 * auVar82._0_4_;
            auVar114._4_4_ = auVar113._4_4_ + fVar235 * auVar82._4_4_;
            auVar114._8_4_ = auVar113._8_4_ + fVar217 * auVar82._8_4_;
            auVar114._12_4_ = auVar113._12_4_ + fVar236 * auVar82._12_4_;
            auVar82 = vsubps_avx(auVar208,auVar145);
            auVar146._0_4_ = auVar145._0_4_ + fVar216 * auVar82._0_4_;
            auVar146._4_4_ = auVar145._4_4_ + fVar235 * auVar82._4_4_;
            auVar146._8_4_ = auVar145._8_4_ + fVar217 * auVar82._8_4_;
            auVar146._12_4_ = auVar145._12_4_ + fVar236 * auVar82._12_4_;
            auVar82 = vsubps_avx(auVar146,auVar114);
            fVar216 = auVar114._0_4_ + fVar216 * auVar82._0_4_;
            fVar235 = auVar114._4_4_ + fVar235 * auVar82._4_4_;
            auVar86._0_8_ = CONCAT44(fVar235,fVar216);
            auVar86._8_4_ = auVar114._8_4_ + fVar217 * auVar82._8_4_;
            auVar86._12_4_ = auVar114._12_4_ + fVar236 * auVar82._12_4_;
            fVar217 = auVar82._0_4_ * 3.0;
            fVar236 = auVar82._4_4_ * 3.0;
            auVar115._0_8_ = CONCAT44(fVar236,fVar217);
            auVar115._8_4_ = auVar82._8_4_ * 3.0;
            auVar115._12_4_ = auVar82._12_4_ * 3.0;
            auVar147._8_8_ = auVar86._0_8_;
            auVar147._0_8_ = auVar86._0_8_;
            auVar82 = vshufpd_avx(auVar86,auVar86,3);
            auVar287 = vshufps_avx(auVar167,auVar167,0x55);
            auVar141 = vsubps_avx(auVar82,auVar147);
            auVar301._0_4_ = auVar141._0_4_ * auVar287._0_4_ + fVar216;
            auVar301._4_4_ = auVar141._4_4_ * auVar287._4_4_ + fVar235;
            auVar301._8_4_ = auVar141._8_4_ * auVar287._8_4_ + fVar216;
            auVar301._12_4_ = auVar141._12_4_ * auVar287._12_4_ + fVar235;
            auVar148._8_8_ = auVar115._0_8_;
            auVar148._0_8_ = auVar115._0_8_;
            auVar82 = vshufpd_avx(auVar115,auVar115,1);
            auVar82 = vsubps_avx(auVar82,auVar148);
            auVar116._0_4_ = auVar82._0_4_ * auVar287._0_4_ + fVar217;
            auVar116._4_4_ = auVar82._4_4_ * auVar287._4_4_ + fVar236;
            auVar116._8_4_ = auVar82._8_4_ * auVar287._8_4_ + fVar217;
            auVar116._12_4_ = auVar82._12_4_ * auVar287._12_4_ + fVar236;
            auVar287 = vmovshdup_avx(auVar116);
            auVar209._0_8_ = auVar287._0_8_ ^ 0x8000000080000000;
            auVar209._8_4_ = auVar287._8_4_ ^ 0x80000000;
            auVar209._12_4_ = auVar287._12_4_ ^ 0x80000000;
            auVar155 = vmovshdup_avx(auVar141);
            auVar82 = vunpcklps_avx(auVar155,auVar209);
            auVar123 = vshufps_avx(auVar82,auVar209,4);
            auVar87._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
            auVar87._8_4_ = -auVar141._8_4_;
            auVar87._12_4_ = -auVar141._12_4_;
            auVar82 = vmovlhps_avx(auVar87,auVar116);
            auVar111 = vshufps_avx(auVar82,auVar116,8);
            auVar82 = ZEXT416((uint)(auVar116._0_4_ * auVar155._0_4_ -
                                    auVar141._0_4_ * auVar287._0_4_));
            auVar287 = vshufps_avx(auVar82,auVar82,0);
            auVar82 = vdivps_avx(auVar123,auVar287);
            auVar287 = vdivps_avx(auVar111,auVar287);
            auVar111 = vinsertps_avx(auVar260,auVar314,0x1c);
            auVar141 = vinsertps_avx(auVar268,auVar324,0x1c);
            auVar112 = vinsertps_avx(auVar314,auVar260,0x4c);
            auVar238 = vinsertps_avx(auVar324,auVar268,0x4c);
            auVar155 = vmovsldup_avx(auVar82);
            auVar149._0_4_ = auVar155._0_4_ * auVar111._0_4_;
            auVar149._4_4_ = auVar155._4_4_ * auVar111._4_4_;
            auVar149._8_4_ = auVar155._8_4_ * auVar111._8_4_;
            auVar149._12_4_ = auVar155._12_4_ * auVar111._12_4_;
            auVar117._0_4_ = auVar141._0_4_ * auVar155._0_4_;
            auVar117._4_4_ = auVar141._4_4_ * auVar155._4_4_;
            auVar117._8_4_ = auVar141._8_4_ * auVar155._8_4_;
            auVar117._12_4_ = auVar141._12_4_ * auVar155._12_4_;
            auVar123 = vminps_avx(auVar149,auVar117);
            auVar155 = vmaxps_avx(auVar117,auVar149);
            auVar76 = vmovsldup_avx(auVar287);
            auVar325._0_4_ = auVar112._0_4_ * auVar76._0_4_;
            auVar325._4_4_ = auVar112._4_4_ * auVar76._4_4_;
            auVar325._8_4_ = auVar112._8_4_ * auVar76._8_4_;
            auVar325._12_4_ = auVar112._12_4_ * auVar76._12_4_;
            auVar150._0_4_ = auVar238._0_4_ * auVar76._0_4_;
            auVar150._4_4_ = auVar238._4_4_ * auVar76._4_4_;
            auVar150._8_4_ = auVar238._8_4_ * auVar76._8_4_;
            auVar150._12_4_ = auVar238._12_4_ * auVar76._12_4_;
            auVar76 = vminps_avx(auVar325,auVar150);
            auVar182._0_4_ = auVar123._0_4_ + auVar76._0_4_;
            auVar182._4_4_ = auVar123._4_4_ + auVar76._4_4_;
            auVar182._8_4_ = auVar123._8_4_ + auVar76._8_4_;
            auVar182._12_4_ = auVar123._12_4_ + auVar76._12_4_;
            auVar123 = vmaxps_avx(auVar150,auVar325);
            auVar76 = vsubps_avx(auVar280,auVar167);
            auVar106 = vsubps_avx(auVar290,auVar167);
            auVar118._0_4_ = auVar155._0_4_ + auVar123._0_4_;
            auVar118._4_4_ = auVar155._4_4_ + auVar123._4_4_;
            auVar118._8_4_ = auVar155._8_4_ + auVar123._8_4_;
            auVar118._12_4_ = auVar155._12_4_ + auVar123._12_4_;
            auVar151._8_8_ = 0x3f800000;
            auVar151._0_8_ = 0x3f800000;
            auVar155 = vsubps_avx(auVar151,auVar118);
            auVar123 = vsubps_avx(auVar151,auVar182);
            fVar219 = auVar76._0_4_;
            auVar183._0_4_ = fVar219 * auVar155._0_4_;
            fVar239 = auVar76._4_4_;
            auVar183._4_4_ = fVar239 * auVar155._4_4_;
            fVar192 = auVar76._8_4_;
            auVar183._8_4_ = fVar192 * auVar155._8_4_;
            fVar193 = auVar76._12_4_;
            auVar183._12_4_ = fVar193 * auVar155._12_4_;
            fVar217 = auVar106._0_4_;
            auVar119._0_4_ = fVar217 * auVar155._0_4_;
            fVar236 = auVar106._4_4_;
            auVar119._4_4_ = fVar236 * auVar155._4_4_;
            fVar218 = auVar106._8_4_;
            auVar119._8_4_ = fVar218 * auVar155._8_4_;
            fVar237 = auVar106._12_4_;
            auVar119._12_4_ = fVar237 * auVar155._12_4_;
            auVar291._0_4_ = fVar219 * auVar123._0_4_;
            auVar291._4_4_ = fVar239 * auVar123._4_4_;
            auVar291._8_4_ = fVar192 * auVar123._8_4_;
            auVar291._12_4_ = fVar193 * auVar123._12_4_;
            auVar152._0_4_ = fVar217 * auVar123._0_4_;
            auVar152._4_4_ = fVar236 * auVar123._4_4_;
            auVar152._8_4_ = fVar218 * auVar123._8_4_;
            auVar152._12_4_ = fVar237 * auVar123._12_4_;
            auVar155 = vminps_avx(auVar183,auVar291);
            auVar123 = vminps_avx(auVar119,auVar152);
            auVar76 = vminps_avx(auVar155,auVar123);
            auVar155 = vmaxps_avx(auVar291,auVar183);
            auVar123 = vmaxps_avx(auVar152,auVar119);
            auVar106 = vshufps_avx(auVar167,auVar167,0x54);
            auVar123 = vmaxps_avx(auVar123,auVar155);
            auVar135 = vshufps_avx(auVar301,auVar301,0);
            auVar162 = vshufps_avx(auVar301,auVar301,0x55);
            auVar155 = vhaddps_avx(auVar76,auVar76);
            auVar123 = vhaddps_avx(auVar123,auVar123);
            auVar168._0_4_ = auVar135._0_4_ * auVar82._0_4_ + auVar162._0_4_ * auVar287._0_4_;
            auVar168._4_4_ = auVar135._4_4_ * auVar82._4_4_ + auVar162._4_4_ * auVar287._4_4_;
            auVar168._8_4_ = auVar135._8_4_ * auVar82._8_4_ + auVar162._8_4_ * auVar287._8_4_;
            auVar168._12_4_ = auVar135._12_4_ * auVar82._12_4_ + auVar162._12_4_ * auVar287._12_4_;
            auVar76 = vsubps_avx(auVar106,auVar168);
            fVar216 = auVar76._0_4_ + auVar155._0_4_;
            fVar235 = auVar76._0_4_ + auVar123._0_4_;
            auVar155 = vmaxss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar216));
            auVar123 = vminss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar221));
            if (auVar155._0_4_ <= auVar123._0_4_) {
              auVar155 = vmovshdup_avx(auVar82);
              auVar88._0_4_ = auVar155._0_4_ * auVar111._0_4_;
              auVar88._4_4_ = auVar155._4_4_ * auVar111._4_4_;
              auVar88._8_4_ = auVar155._8_4_ * auVar111._8_4_;
              auVar88._12_4_ = auVar155._12_4_ * auVar111._12_4_;
              auVar120._0_4_ = auVar141._0_4_ * auVar155._0_4_;
              auVar120._4_4_ = auVar141._4_4_ * auVar155._4_4_;
              auVar120._8_4_ = auVar141._8_4_ * auVar155._8_4_;
              auVar120._12_4_ = auVar141._12_4_ * auVar155._12_4_;
              auVar123 = vminps_avx(auVar88,auVar120);
              auVar155 = vmaxps_avx(auVar120,auVar88);
              auVar111 = vmovshdup_avx(auVar287);
              auVar184._0_4_ = auVar112._0_4_ * auVar111._0_4_;
              auVar184._4_4_ = auVar112._4_4_ * auVar111._4_4_;
              auVar184._8_4_ = auVar112._8_4_ * auVar111._8_4_;
              auVar184._12_4_ = auVar112._12_4_ * auVar111._12_4_;
              auVar121._0_4_ = auVar238._0_4_ * auVar111._0_4_;
              auVar121._4_4_ = auVar238._4_4_ * auVar111._4_4_;
              auVar121._8_4_ = auVar238._8_4_ * auVar111._8_4_;
              auVar121._12_4_ = auVar238._12_4_ * auVar111._12_4_;
              auVar111 = vminps_avx(auVar184,auVar121);
              auVar153._0_4_ = auVar123._0_4_ + auVar111._0_4_;
              auVar153._4_4_ = auVar123._4_4_ + auVar111._4_4_;
              auVar153._8_4_ = auVar123._8_4_ + auVar111._8_4_;
              auVar153._12_4_ = auVar123._12_4_ + auVar111._12_4_;
              auVar123 = vmaxps_avx(auVar121,auVar184);
              auVar89._0_4_ = auVar155._0_4_ + auVar123._0_4_;
              auVar89._4_4_ = auVar155._4_4_ + auVar123._4_4_;
              auVar89._8_4_ = auVar155._8_4_ + auVar123._8_4_;
              auVar89._12_4_ = auVar155._12_4_ + auVar123._12_4_;
              auVar155 = vsubps_avx(auVar229,auVar89);
              auVar123 = vsubps_avx(auVar229,auVar153);
              auVar154._0_4_ = fVar219 * auVar155._0_4_;
              auVar154._4_4_ = fVar239 * auVar155._4_4_;
              auVar154._8_4_ = fVar192 * auVar155._8_4_;
              auVar154._12_4_ = fVar193 * auVar155._12_4_;
              auVar185._0_4_ = fVar219 * auVar123._0_4_;
              auVar185._4_4_ = fVar239 * auVar123._4_4_;
              auVar185._8_4_ = fVar192 * auVar123._8_4_;
              auVar185._12_4_ = fVar193 * auVar123._12_4_;
              auVar90._0_4_ = fVar217 * auVar155._0_4_;
              auVar90._4_4_ = fVar236 * auVar155._4_4_;
              auVar90._8_4_ = fVar218 * auVar155._8_4_;
              auVar90._12_4_ = fVar237 * auVar155._12_4_;
              auVar122._0_4_ = fVar217 * auVar123._0_4_;
              auVar122._4_4_ = fVar236 * auVar123._4_4_;
              auVar122._8_4_ = fVar218 * auVar123._8_4_;
              auVar122._12_4_ = fVar237 * auVar123._12_4_;
              auVar155 = vminps_avx(auVar154,auVar185);
              auVar123 = vminps_avx(auVar90,auVar122);
              auVar155 = vminps_avx(auVar155,auVar123);
              auVar123 = vmaxps_avx(auVar185,auVar154);
              auVar111 = vmaxps_avx(auVar122,auVar90);
              auVar155 = vhaddps_avx(auVar155,auVar155);
              auVar123 = vmaxps_avx(auVar111,auVar123);
              auVar123 = vhaddps_avx(auVar123,auVar123);
              auVar111 = vmovshdup_avx(auVar76);
              auVar141 = ZEXT416((uint)(auVar111._0_4_ + auVar155._0_4_));
              auVar155 = vmaxss_avx(auVar334,auVar141);
              auVar111 = ZEXT416((uint)(auVar111._0_4_ + auVar123._0_4_));
              auVar123 = vminss_avx(auVar111,auVar105);
              if (auVar155._0_4_ <= auVar123._0_4_) {
                bVar69 = 0;
                if ((fVar234 < fVar216) && (fVar235 < fVar221)) {
                  auVar155 = vcmpps_avx(auVar111,auVar105,1);
                  auVar123 = vcmpps_avx(auVar334,auVar141,1);
                  auVar155 = vandps_avx(auVar123,auVar155);
                  bVar69 = auVar155[0];
                }
                auVar296 = ZEXT1664(auVar334);
                if ((uVar74 < 4 && 0.001 <= fVar215) && (bVar69 & 1) == 0) goto LAB_0100d19c;
                lVar73 = 200;
                do {
                  fVar215 = auVar76._0_4_;
                  fVar221 = 1.0 - fVar215;
                  auVar155 = ZEXT416((uint)(fVar221 * fVar221 * fVar221));
                  auVar155 = vshufps_avx(auVar155,auVar155,0);
                  auVar123 = ZEXT416((uint)(fVar215 * 3.0 * fVar221 * fVar221));
                  auVar123 = vshufps_avx(auVar123,auVar123,0);
                  auVar111 = ZEXT416((uint)(fVar221 * fVar215 * fVar215 * 3.0));
                  auVar111 = vshufps_avx(auVar111,auVar111,0);
                  auVar141 = ZEXT416((uint)(fVar215 * fVar215 * fVar215));
                  auVar141 = vshufps_avx(auVar141,auVar141,0);
                  local_5b0._0_4_ = auVar11._0_4_;
                  local_5b0._4_4_ = auVar11._4_4_;
                  fStack_5a8 = auVar11._8_4_;
                  fStack_5a4 = auVar11._12_4_;
                  fVar221 = auVar155._0_4_ * local_630 +
                            auVar123._0_4_ * (float)local_6f0._0_4_ +
                            auVar141._0_4_ * (float)local_5b0._0_4_ + auVar111._0_4_ * local_640;
                  fVar215 = auVar155._4_4_ * fStack_62c +
                            auVar123._4_4_ * (float)local_6f0._4_4_ +
                            auVar141._4_4_ * (float)local_5b0._4_4_ + auVar111._4_4_ * fStack_63c;
                  auVar91._0_8_ = CONCAT44(fVar215,fVar221);
                  auVar91._8_4_ =
                       auVar155._8_4_ * fStack_628 +
                       auVar123._8_4_ * fStack_6e8 +
                       auVar141._8_4_ * fStack_5a8 + auVar111._8_4_ * fStack_638;
                  auVar91._12_4_ =
                       auVar155._12_4_ * fStack_624 +
                       auVar123._12_4_ * fStack_6e4 +
                       auVar141._12_4_ * fStack_5a4 + auVar111._12_4_ * fStack_634;
                  auVar124._8_8_ = auVar91._0_8_;
                  auVar124._0_8_ = auVar91._0_8_;
                  auVar123 = vshufpd_avx(auVar91,auVar91,1);
                  auVar155 = vmovshdup_avx(auVar76);
                  auVar123 = vsubps_avx(auVar123,auVar124);
                  auVar92._0_4_ = auVar155._0_4_ * auVar123._0_4_ + fVar221;
                  auVar92._4_4_ = auVar155._4_4_ * auVar123._4_4_ + fVar215;
                  auVar92._8_4_ = auVar155._8_4_ * auVar123._8_4_ + fVar221;
                  auVar92._12_4_ = auVar155._12_4_ * auVar123._12_4_ + fVar215;
                  auVar155 = vshufps_avx(auVar92,auVar92,0);
                  auVar123 = vshufps_avx(auVar92,auVar92,0x55);
                  auVar125._0_4_ = auVar82._0_4_ * auVar155._0_4_ + auVar287._0_4_ * auVar123._0_4_;
                  auVar125._4_4_ = auVar82._4_4_ * auVar155._4_4_ + auVar287._4_4_ * auVar123._4_4_;
                  auVar125._8_4_ = auVar82._8_4_ * auVar155._8_4_ + auVar287._8_4_ * auVar123._8_4_;
                  auVar125._12_4_ =
                       auVar82._12_4_ * auVar155._12_4_ + auVar287._12_4_ * auVar123._12_4_;
                  auVar76 = vsubps_avx(auVar76,auVar125);
                  auVar126._8_4_ = 0x7fffffff;
                  auVar126._0_8_ = 0x7fffffff7fffffff;
                  auVar126._12_4_ = 0x7fffffff;
                  auVar155 = vandps_avx(auVar92,auVar126);
                  auVar123 = vshufps_avx(auVar155,auVar155,0xf5);
                  auVar155 = vmaxss_avx(auVar123,auVar155);
                  if (auVar155._0_4_ < (float)local_370._0_4_) {
                    fVar221 = auVar76._0_4_;
                    if ((fVar221 < 0.0) || (1.0 < fVar221)) break;
                    auVar82 = vmovshdup_avx(auVar76);
                    fVar215 = auVar82._0_4_;
                    if ((fVar215 < 0.0) || (1.0 < fVar215)) break;
                    auVar82 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar238 = vinsertps_avx(auVar82,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar82 = vdpps_avx(auVar238,local_3b0,0x7f);
                    auVar287 = vdpps_avx(auVar238,local_3c0,0x7f);
                    auVar155 = vdpps_avx(auVar238,local_3d0,0x7f);
                    auVar123 = vdpps_avx(auVar238,local_3e0,0x7f);
                    auVar111 = vdpps_avx(auVar238,local_3f0,0x7f);
                    auVar141 = vdpps_avx(auVar238,local_400,0x7f);
                    auVar112 = vdpps_avx(auVar238,local_410,0x7f);
                    auVar238 = vdpps_avx(auVar238,local_420,0x7f);
                    fVar236 = 1.0 - fVar215;
                    fVar218 = 1.0 - fVar221;
                    fVar234 = auVar76._4_4_;
                    fVar216 = auVar76._8_4_;
                    fVar235 = auVar76._12_4_;
                    fVar217 = fVar218 * fVar221 * fVar221 * 3.0;
                    auVar248._0_4_ = fVar221 * fVar221 * fVar221;
                    auVar248._4_4_ = fVar234 * fVar234 * fVar234;
                    auVar248._8_4_ = fVar216 * fVar216 * fVar216;
                    auVar248._12_4_ = fVar235 * fVar235 * fVar235;
                    fVar216 = fVar218 * fVar218 * fVar221 * 3.0;
                    fVar235 = fVar218 * fVar218 * fVar218;
                    fVar234 = fVar235 * (fVar236 * auVar82._0_4_ + fVar215 * auVar111._0_4_) +
                              (fVar236 * auVar287._0_4_ + auVar141._0_4_ * fVar215) * fVar216 +
                              fVar217 * (auVar112._0_4_ * fVar215 + fVar236 * auVar155._0_4_) +
                              auVar248._0_4_ * (fVar236 * auVar123._0_4_ + fVar215 * auVar238._0_4_)
                    ;
                    if (((fVar234 < fVar197) ||
                        (fVar236 = *(float *)(ray + k * 4 + 0x100), fVar236 < fVar234)) ||
                       (pGVar14 = (context->scene->geometries).items[uVar67].ptr,
                       (pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar76,auVar76,0x55);
                    auVar269._8_4_ = 0x3f800000;
                    auVar269._0_8_ = 0x3f8000003f800000;
                    auVar269._12_4_ = 0x3f800000;
                    auVar82 = vsubps_avx(auVar269,auStack_f0);
                    fVar237 = auStack_f0._0_4_;
                    fVar219 = auStack_f0._4_4_;
                    fVar239 = auStack_f0._8_4_;
                    fVar192 = auStack_f0._12_4_;
                    fVar193 = auVar82._0_4_;
                    fVar194 = auVar82._4_4_;
                    fVar195 = auVar82._8_4_;
                    fVar196 = auVar82._12_4_;
                    auVar281._0_4_ =
                         fVar237 * (float)local_4b0._0_4_ + fVar193 * (float)local_4a0._0_4_;
                    auVar281._4_4_ =
                         fVar219 * (float)local_4b0._4_4_ + fVar194 * (float)local_4a0._4_4_;
                    auVar281._8_4_ = fVar239 * fStack_4a8 + fVar195 * fStack_498;
                    auVar281._12_4_ = fVar192 * fStack_4a4 + fVar196 * fStack_494;
                    auVar292._0_4_ =
                         fVar237 * (float)local_500._0_4_ + fVar193 * (float)local_4e0._0_4_;
                    auVar292._4_4_ =
                         fVar219 * (float)local_500._4_4_ + fVar194 * (float)local_4e0._4_4_;
                    auVar292._8_4_ = fVar239 * fStack_4f8 + fVar195 * fStack_4d8;
                    auVar292._12_4_ = fVar192 * fStack_4f4 + fVar196 * fStack_4d4;
                    auVar302._0_4_ =
                         fVar237 * (float)local_440._0_4_ + fVar193 * (float)local_4f0._0_4_;
                    auVar302._4_4_ =
                         fVar219 * (float)local_440._4_4_ + fVar194 * (float)local_4f0._4_4_;
                    auVar302._8_4_ = fVar239 * fStack_438 + fVar195 * fStack_4e8;
                    auVar302._12_4_ = fVar192 * fStack_434 + fVar196 * fStack_4e4;
                    auVar270._0_4_ =
                         fVar237 * (float)local_4d0._0_4_ + fVar193 * (float)local_4c0._0_4_;
                    auVar270._4_4_ =
                         fVar219 * (float)local_4d0._4_4_ + fVar194 * (float)local_4c0._4_4_;
                    auVar270._8_4_ = fVar239 * fStack_4c8 + fVar195 * fStack_4b8;
                    auVar270._12_4_ = fVar192 * fStack_4c4 + fVar196 * fStack_4b4;
                    auVar123 = vsubps_avx(auVar292,auVar281);
                    auVar111 = vsubps_avx(auVar302,auVar292);
                    auVar141 = vsubps_avx(auVar270,auVar302);
                    auStack_110 = vshufps_avx(auVar76,auVar76,0);
                    fVar192 = auStack_110._0_4_;
                    fVar193 = auStack_110._4_4_;
                    fVar194 = auStack_110._8_4_;
                    fVar195 = auStack_110._12_4_;
                    auVar82 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                    fVar218 = auVar82._0_4_;
                    fVar237 = auVar82._4_4_;
                    fVar219 = auVar82._8_4_;
                    fVar239 = auVar82._12_4_;
                    auVar82 = vshufps_avx(auVar248,auVar248,0);
                    auVar287 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
                    auVar155 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
                    auVar230._0_4_ =
                         (fVar218 * (fVar218 * auVar123._0_4_ + fVar192 * auVar111._0_4_) +
                         fVar192 * (fVar218 * auVar111._0_4_ + fVar192 * auVar141._0_4_)) * 3.0;
                    auVar230._4_4_ =
                         (fVar237 * (fVar237 * auVar123._4_4_ + fVar193 * auVar111._4_4_) +
                         fVar193 * (fVar237 * auVar111._4_4_ + fVar193 * auVar141._4_4_)) * 3.0;
                    auVar230._8_4_ =
                         (fVar219 * (fVar219 * auVar123._8_4_ + fVar194 * auVar111._8_4_) +
                         fVar194 * (fVar219 * auVar111._8_4_ + fVar194 * auVar141._8_4_)) * 3.0;
                    auVar230._12_4_ =
                         (fVar239 * (fVar239 * auVar123._12_4_ + fVar195 * auVar111._12_4_) +
                         fVar195 * (fVar239 * auVar111._12_4_ + fVar195 * auVar141._12_4_)) * 3.0;
                    auVar123 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
                    auVar186._0_4_ =
                         auVar123._0_4_ * (float)local_450._0_4_ +
                         auVar155._0_4_ * (float)local_460._0_4_ +
                         auVar82._0_4_ * (float)local_480._0_4_ +
                         auVar287._0_4_ * (float)local_470._0_4_;
                    auVar186._4_4_ =
                         auVar123._4_4_ * (float)local_450._4_4_ +
                         auVar155._4_4_ * (float)local_460._4_4_ +
                         auVar82._4_4_ * (float)local_480._4_4_ +
                         auVar287._4_4_ * (float)local_470._4_4_;
                    auVar186._8_4_ =
                         auVar123._8_4_ * fStack_448 +
                         auVar155._8_4_ * fStack_458 +
                         auVar82._8_4_ * fStack_478 + auVar287._8_4_ * fStack_468;
                    auVar186._12_4_ =
                         auVar123._12_4_ * fStack_444 +
                         auVar155._12_4_ * fStack_454 +
                         auVar82._12_4_ * fStack_474 + auVar287._12_4_ * fStack_464;
                    auVar82 = vshufps_avx(auVar230,auVar230,0xc9);
                    auVar210._0_4_ = auVar186._0_4_ * auVar82._0_4_;
                    auVar210._4_4_ = auVar186._4_4_ * auVar82._4_4_;
                    auVar210._8_4_ = auVar186._8_4_ * auVar82._8_4_;
                    auVar210._12_4_ = auVar186._12_4_ * auVar82._12_4_;
                    auVar82 = vshufps_avx(auVar186,auVar186,0xc9);
                    auVar187._0_4_ = auVar230._0_4_ * auVar82._0_4_;
                    auVar187._4_4_ = auVar230._4_4_ * auVar82._4_4_;
                    auVar187._8_4_ = auVar230._8_4_ * auVar82._8_4_;
                    auVar187._12_4_ = auVar230._12_4_ * auVar82._12_4_;
                    auVar82 = vsubps_avx(auVar187,auVar210);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar234;
                      uVar6 = vextractps_avx(auVar82,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                      uVar6 = vextractps_avx(auVar82,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar82._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar221;
                      *(float *)(ray + k * 4 + 0x200) = fVar215;
                      *(uint *)(ray + k * 4 + 0x220) = uVar13;
                      *(uint *)(ray + k * 4 + 0x240) = uVar67;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar82,auVar82,0x55);
                    auStack_150 = vshufps_avx(auVar82,auVar82,0xaa);
                    auStack_130 = vshufps_avx(auVar82,auVar82,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_300._0_8_;
                    uStack_d8 = local_300._8_8_;
                    uStack_d0 = local_300._16_8_;
                    uStack_c8 = local_300._24_8_;
                    local_c0 = local_2e0._0_8_;
                    uStack_b8 = local_2e0._8_8_;
                    uStack_b0 = local_2e0._16_8_;
                    uStack_a8 = local_2e0._24_8_;
                    auVar93 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar93._28_4_;
                    uVar71 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar234;
                    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar70 & 0xf) << 4));
                    local_570 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar70 >> 4) * 0x10);
                    local_550.valid = (int *)local_580;
                    local_550.geometryUserPtr = pGVar14->userPtr;
                    local_550.context = context->user;
                    local_550.hit = local_180;
                    local_550.N = 8;
                    local_550.ray = (RTCRayN *)ray;
                    if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->intersectionFilterN)(&local_550);
                    }
                    auVar82 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                    auVar287 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                    auVar161._16_16_ = auVar287;
                    auVar161._0_16_ = auVar82;
                    auVar19 = auVar93 & ~auVar161;
                    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0x7f,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0xbf,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar19[0x1f] < '\0') {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_550);
                      }
                      auVar82 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                      auVar287 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                      auVar102._16_16_ = auVar287;
                      auVar102._0_16_ = auVar82;
                      auVar19 = auVar93 & ~auVar102;
                      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar19 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar19 >> 0x7f,0) != '\0') ||
                            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0xbf,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar19[0x1f] < '\0') {
                        auVar103._0_4_ = auVar82._0_4_ ^ auVar93._0_4_;
                        auVar103._4_4_ = auVar82._4_4_ ^ auVar93._4_4_;
                        auVar103._8_4_ = auVar82._8_4_ ^ auVar93._8_4_;
                        auVar103._12_4_ = auVar82._12_4_ ^ auVar93._12_4_;
                        auVar103._16_4_ = auVar287._0_4_ ^ auVar93._16_4_;
                        auVar103._20_4_ = auVar287._4_4_ ^ auVar93._20_4_;
                        auVar103._24_4_ = auVar287._8_4_ ^ auVar93._24_4_;
                        auVar103._28_4_ = auVar287._12_4_ ^ uVar71;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])local_550.hit);
                        *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0x20));
                        *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0x40));
                        *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0x60));
                        *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0x80));
                        *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0xa0));
                        *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0xc0));
                        *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0xe0));
                        *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar93;
                        auVar93 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                           (local_550.hit + 0x100));
                        *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar93;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar236;
                    break;
                  }
                  lVar73 = lVar73 + -1;
                } while (lVar73 != 0);
              }
            }
          }
        }
        if (uVar74 == 0) break;
      } while( true );
    }
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar104._4_4_ = uVar6;
    auVar104._0_4_ = uVar6;
    auVar104._8_4_ = uVar6;
    auVar104._12_4_ = uVar6;
    auVar104._16_4_ = uVar6;
    auVar104._20_4_ = uVar6;
    auVar104._24_4_ = uVar6;
    auVar104._28_4_ = uVar6;
    auVar93 = vcmpps_avx(local_2c0,auVar104,2);
    uVar67 = vmovmskps_avx(auVar93);
    uVar67 = (uint)uVar75 & uVar67;
    if (uVar67 == 0) {
      return;
    }
  } while( true );
LAB_0100d19c:
  auVar82 = vinsertps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar221),0x10);
  auVar304 = ZEXT1664(auVar82);
  goto LAB_0100b9b5;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }